

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  size_t k;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [28];
  GridSOA *pGVar73;
  GridSOA *pGVar74;
  GridSOA *pGVar75;
  GridSOA *pGVar76;
  GridSOA *pGVar77;
  GridSOA *pGVar78;
  byte bVar79;
  bool bVar80;
  int iVar81;
  long lVar82;
  ulong uVar83;
  undefined1 (*pauVar84) [32];
  ulong uVar85;
  uint uVar86;
  long lVar87;
  ulong *puVar88;
  NodeRef root;
  ulong uVar89;
  long lVar90;
  undefined4 uVar91;
  ulong unaff_R15;
  long lVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar106;
  float fVar107;
  float fVar123;
  float fVar125;
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar127;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar124;
  float fVar126;
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar134;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar129;
  float fVar131;
  float fVar133;
  undefined1 auVar122 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar159;
  undefined1 auVar158 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar178 [36];
  undefined1 auVar177 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar179 [16];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar192;
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  float fVar197;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar198 [64];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float fStack_2e88;
  Precalculations local_2e40;
  RTCFilterFunctionNArguments local_2e30;
  undefined1 local_2e00 [32];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  undefined1 local_2d80 [32];
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [32];
  BVH *local_2d18;
  Intersectors *local_2d10;
  GridSOA *local_2d08;
  GridSOA *local_2d00;
  long local_2cf8;
  GridSOA *local_2cf0;
  GridSOA *local_2ce8;
  GridSOA *local_2ce0;
  GridSOA *local_2cd8;
  GridSOA *local_2cd0;
  GridSOA *local_2cc8;
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [8];
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [8];
  undefined8 uStack_2c38;
  float fStack_2c30;
  float fStack_2c2c;
  float fStack_2c28;
  undefined4 uStack_2c24;
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  uint local_2ae0;
  uint uStack_2adc;
  uint uStack_2ad8;
  uint uStack_2ad4;
  uint uStack_2ad0;
  uint uStack_2acc;
  uint uStack_2ac8;
  uint uStack_2ac4;
  uint local_2ac0;
  uint uStack_2abc;
  uint uStack_2ab8;
  uint uStack_2ab4;
  uint uStack_2ab0;
  uint uStack_2aac;
  uint uStack_2aa8;
  uint uStack_2aa4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2aa0;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined1 local_29c0 [8];
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar144 [32];
  
  local_2d18 = (BVH *)This->ptr;
  local_2608 = (local_2d18->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar93 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar108 = ZEXT816(0) << 0x40;
      auVar98 = vpcmpeqd_avx2(auVar93,(undefined1  [32])valid_i->field_0);
      auVar93 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar108),5);
      auVar120 = auVar98 & auVar93;
      if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0x7f,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar120 >> 0xbf,0) != '\0') ||
          (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar120[0x1f] < '\0') {
        auVar93 = vandps_avx(auVar93,auVar98);
        auVar135 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
        local_2e40.super_Precalculations.grid = (GridSOA *)0x0;
        local_2aa0._0_8_ = *(undefined8 *)ray;
        local_2aa0._8_8_ = *(undefined8 *)(ray + 8);
        local_2aa0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2aa0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2aa0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2aa0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2aa0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2aa0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2aa0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2aa0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2aa0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2aa0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2a40 = *(undefined1 (*) [32])(ray + 0x80);
        local_2a20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2c80._8_4_ = 0x7fffffff;
        local_2c80._0_8_ = 0x7fffffff7fffffff;
        local_2c80._12_4_ = 0x7fffffff;
        local_2c80._16_4_ = 0x7fffffff;
        local_2c80._20_4_ = 0x7fffffff;
        local_2c80._24_4_ = 0x7fffffff;
        local_2c80._28_4_ = 0x7fffffff;
        auVar119._8_4_ = 0x219392ef;
        auVar119._0_8_ = 0x219392ef219392ef;
        auVar119._12_4_ = 0x219392ef;
        auVar119._16_4_ = 0x219392ef;
        auVar119._20_4_ = 0x219392ef;
        auVar119._24_4_ = 0x219392ef;
        auVar119._28_4_ = 0x219392ef;
        auVar190 = ZEXT3264(auVar119);
        auVar193._8_4_ = 0x3f800000;
        auVar193._0_8_ = 0x3f8000003f800000;
        auVar193._12_4_ = 0x3f800000;
        auVar193._16_4_ = 0x3f800000;
        auVar193._20_4_ = 0x3f800000;
        auVar193._24_4_ = 0x3f800000;
        auVar193._28_4_ = 0x3f800000;
        local_2a00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar156 = vdivps_avx(auVar193,local_2a40);
        auVar93 = vandps_avx(local_2c80,local_2a40);
        auVar120 = vcmpps_avx(auVar93,auVar119,1);
        auVar93 = vandps_avx(local_2c80,local_2a20);
        auVar98 = vcmpps_avx(auVar93,auVar119,1);
        auVar99 = vdivps_avx(auVar193,local_2a20);
        auVar93 = vandps_avx(local_2c80,local_2a00);
        auVar187._8_4_ = 0x5d5e0b6b;
        auVar187._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar187._12_4_ = 0x5d5e0b6b;
        auVar187._16_4_ = 0x5d5e0b6b;
        auVar187._20_4_ = 0x5d5e0b6b;
        auVar187._24_4_ = 0x5d5e0b6b;
        auVar187._28_4_ = 0x5d5e0b6b;
        _local_29e0 = vblendvps_avx(auVar156,auVar187,auVar120);
        auVar93 = vcmpps_avx(auVar93,auVar119,1);
        auVar120 = vdivps_avx(auVar193,local_2a00);
        auVar185 = ZEXT3264(auVar120);
        _local_29c0 = vblendvps_avx(auVar99,auVar187,auVar98);
        _local_29a0 = vblendvps_avx(auVar120,auVar187,auVar93);
        auVar173 = ZEXT3264(_local_29a0);
        auVar93 = vcmpps_avx(_local_29e0,ZEXT1632(auVar108),1);
        auVar99._8_4_ = 0x10;
        auVar99._0_8_ = 0x1000000010;
        auVar99._12_4_ = 0x10;
        auVar99._16_4_ = 0x10;
        auVar99._20_4_ = 0x10;
        auVar99._24_4_ = 0x10;
        auVar99._28_4_ = 0x10;
        local_2980 = vandps_avx(auVar93,auVar99);
        auVar120 = ZEXT1632(auVar108);
        auVar93 = vcmpps_avx(_local_29c0,auVar120,5);
        auVar98._8_4_ = 0x20;
        auVar98._0_8_ = 0x2000000020;
        auVar98._12_4_ = 0x20;
        auVar98._16_4_ = 0x20;
        auVar98._20_4_ = 0x20;
        auVar98._24_4_ = 0x20;
        auVar98._28_4_ = 0x20;
        auVar160._8_4_ = 0x30;
        auVar160._0_8_ = 0x3000000030;
        auVar160._12_4_ = 0x30;
        auVar160._16_4_ = 0x30;
        auVar160._20_4_ = 0x30;
        auVar160._24_4_ = 0x30;
        auVar160._28_4_ = 0x30;
        local_2960 = vblendvps_avx(auVar160,auVar98,auVar93);
        auVar93 = vcmpps_avx(_local_29a0,auVar120,5);
        auVar156._8_4_ = 0x40;
        auVar156._0_8_ = 0x4000000040;
        auVar156._12_4_ = 0x40;
        auVar156._16_4_ = 0x40;
        auVar156._20_4_ = 0x40;
        auVar156._24_4_ = 0x40;
        auVar156._28_4_ = 0x40;
        auVar161._8_4_ = 0x50;
        auVar161._0_8_ = 0x5000000050;
        auVar161._12_4_ = 0x50;
        auVar161._16_4_ = 0x50;
        auVar161._20_4_ = 0x50;
        auVar161._24_4_ = 0x50;
        auVar161._28_4_ = 0x50;
        local_2940 = vblendvps_avx(auVar161,auVar156,auVar93);
        auVar93 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar120);
        local_28c0 = vpmovsxwd_avx2(auVar135);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar194 = ZEXT3264(local_1e80);
        local_2920 = vblendvps_avx(local_1e80,auVar93,local_28c0);
        auVar93 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar120);
        auVar120._8_4_ = 0xff800000;
        auVar120._0_8_ = 0xff800000ff800000;
        auVar120._12_4_ = 0xff800000;
        auVar120._16_4_ = 0xff800000;
        auVar120._20_4_ = 0xff800000;
        auVar120._24_4_ = 0xff800000;
        auVar120._28_4_ = 0xff800000;
        local_2900 = vblendvps_avx(auVar120,auVar93,local_28c0);
        auVar108 = vpcmpeqd_avx(local_2900._0_16_,local_2900._0_16_);
        local_2cc0 = vpmovsxwd_avx2(auVar135 ^ auVar108);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar86 = 5;
        }
        else {
          uVar86 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        pRVar1 = ray + 0x100;
        puVar88 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar84 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2920;
        local_28e0 = mm_lookupmask_ps._16_8_;
        uStack_28d8 = mm_lookupmask_ps._24_8_;
        uStack_28d0 = mm_lookupmask_ps._16_8_;
        uStack_28c8 = mm_lookupmask_ps._24_8_;
        auVar196 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar198 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        local_2d10 = This;
LAB_019d2b20:
        do {
          do {
            root.ptr = puVar88[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_019d40f1;
            puVar88 = puVar88 + -1;
            pauVar84 = pauVar84 + -1;
            local_2e00 = *pauVar84;
            auVar122 = ZEXT3264(local_2e00);
            auVar93 = vcmpps_avx(local_2e00,local_2900,1);
          } while ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar93 >> 0x7f,0) == '\0') &&
                     (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar93 >> 0xbf,0) == '\0') &&
                   (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar93[0x1f]);
          uVar91 = vmovmskps_avx(auVar93);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar91);
          if (uVar86 < (uint)POPCOUNT(uVar91)) {
LAB_019d2b5e:
            do {
              pGVar73 = local_2e40.super_Precalculations.grid;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_019d40f1;
                auVar120 = auVar122._0_32_;
                auVar93 = vcmpps_avx(local_2900,auVar120,6);
                if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar93 >> 0x7f,0) != '\0') ||
                      (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar93 >> 0xbf,0) != '\0') ||
                    (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar93[0x1f] < '\0') {
                  if (((uint)root.ptr & 0xf) == 8) {
                    auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
                    auVar196 = ZEXT3264(auVar93 ^ local_2cc0);
                    uVar85 = (ulong)*(uint *)(local_2e40.super_Precalculations.grid + 0x14);
                    uVar5 = *(uint *)(local_2e40.super_Precalculations.grid + 0xc);
                    iVar81 = *(int *)(local_2e40.super_Precalculations.grid + 0x10);
                    uVar83 = (ulong)*(uint *)(local_2e40.super_Precalculations.grid + 0x24);
                    lVar82 = uVar83 + uVar85 * 0xc;
                    uVar89 = root.ptr >> 4;
                    local_2ce0 = local_2e40.super_Precalculations.grid + uVar89 * 4 + lVar82 + 0x30;
                    lVar87 = (ulong)uVar5 << 2;
                    local_2ce8 = local_2e40.super_Precalculations.grid +
                                 uVar89 * 4 + uVar83 + uVar85 * 8 + 0x30;
                    local_2cf0 = local_2e40.super_Precalculations.grid +
                                 uVar89 * 4 + uVar83 + uVar85 * 4 + 0x30;
                    local_2cf8 = uVar83 + uVar89 * 4 + 0x30;
                    local_2d00 = local_2e40.super_Precalculations.grid + uVar89 * 4 + lVar82 + 0x2c;
                    local_2d08 = local_2e40.super_Precalculations.grid + uVar83 + uVar89 * 4 + 0x30;
                    bVar79 = 1;
                    unaff_R15 = 0;
                    do {
                      pGVar78 = local_2ce0;
                      pGVar77 = local_2ce8;
                      pGVar76 = local_2cf0;
                      pGVar75 = local_2d00;
                      pGVar74 = local_2d08;
                      lVar82 = lVar87 * unaff_R15;
                      local_2cd0 = local_2ce8 + lVar82;
                      local_2cd8 = local_2cf0 + lVar82;
                      local_2cc8 = pGVar73 + lVar82 + local_2cf8;
                      lVar92 = (unaff_R15 + 1) * lVar87;
                      lVar90 = 0;
                      auVar93 = auVar196._0_32_;
                      do {
                        uVar91 = *(undefined4 *)(local_2cc8 + lVar90 * 4 + -4);
                        auVar94._4_4_ = uVar91;
                        auVar94._0_4_ = uVar91;
                        auVar94._8_4_ = uVar91;
                        auVar94._12_4_ = uVar91;
                        auVar94._16_4_ = uVar91;
                        auVar94._20_4_ = uVar91;
                        auVar94._24_4_ = uVar91;
                        auVar94._28_4_ = uVar91;
                        uVar91 = *(undefined4 *)(local_2cd8 + lVar90 * 4 + -4);
                        auVar115._4_4_ = uVar91;
                        auVar115._0_4_ = uVar91;
                        auVar115._8_4_ = uVar91;
                        auVar115._12_4_ = uVar91;
                        auVar115._16_4_ = uVar91;
                        auVar115._20_4_ = uVar91;
                        auVar115._24_4_ = uVar91;
                        auVar115._28_4_ = uVar91;
                        uVar91 = *(undefined4 *)(local_2cd0 + lVar90 * 4 + -4);
                        auVar136._4_4_ = uVar91;
                        auVar136._0_4_ = uVar91;
                        auVar136._8_4_ = uVar91;
                        auVar136._12_4_ = uVar91;
                        auVar136._16_4_ = uVar91;
                        auVar136._20_4_ = uVar91;
                        auVar136._24_4_ = uVar91;
                        auVar136._28_4_ = uVar91;
                        uVar91 = *(undefined4 *)(pGVar74 + lVar90 * 4 + lVar92 + -4);
                        local_2640._4_4_ = uVar91;
                        local_2640._0_4_ = uVar91;
                        local_2640._8_4_ = uVar91;
                        local_2640._12_4_ = uVar91;
                        local_2640._16_4_ = uVar91;
                        local_2640._20_4_ = uVar91;
                        local_2640._24_4_ = uVar91;
                        local_2640._28_4_ = uVar91;
                        uVar91 = *(undefined4 *)(pGVar76 + lVar90 * 4 + lVar92 + -4);
                        local_2660._4_4_ = uVar91;
                        local_2660._0_4_ = uVar91;
                        local_2660._8_4_ = uVar91;
                        local_2660._12_4_ = uVar91;
                        local_2660._16_4_ = uVar91;
                        local_2660._20_4_ = uVar91;
                        local_2660._24_4_ = uVar91;
                        local_2660._28_4_ = uVar91;
                        uVar91 = *(undefined4 *)(pGVar77 + lVar90 * 4 + lVar92 + -4);
                        local_2680._4_4_ = uVar91;
                        local_2680._0_4_ = uVar91;
                        local_2680._8_4_ = uVar91;
                        local_2680._12_4_ = uVar91;
                        local_2680._16_4_ = uVar91;
                        local_2680._20_4_ = uVar91;
                        local_2680._24_4_ = uVar91;
                        local_2680._28_4_ = uVar91;
                        auVar120 = *(undefined1 (*) [32])ray;
                        auVar98 = *(undefined1 (*) [32])(ray + 0x20);
                        auVar156 = *(undefined1 (*) [32])(ray + 0x40);
                        auVar160 = vsubps_avx(auVar94,auVar120);
                        auVar161 = vsubps_avx(auVar115,auVar98);
                        local_2d60 = vsubps_avx(auVar136,auVar156);
                        auVar187 = vsubps_avx(local_2660,auVar98);
                        auVar119 = vsubps_avx(local_2680,auVar156);
                        auVar193 = vsubps_avx(auVar187,auVar161);
                        local_2d80 = vsubps_avx(auVar119,local_2d60);
                        auVar148._0_4_ = auVar187._0_4_ + auVar161._0_4_;
                        auVar148._4_4_ = auVar187._4_4_ + auVar161._4_4_;
                        auVar148._8_4_ = auVar187._8_4_ + auVar161._8_4_;
                        auVar148._12_4_ = auVar187._12_4_ + auVar161._12_4_;
                        auVar148._16_4_ = auVar187._16_4_ + auVar161._16_4_;
                        auVar148._20_4_ = auVar187._20_4_ + auVar161._20_4_;
                        auVar148._24_4_ = auVar187._24_4_ + auVar161._24_4_;
                        auVar148._28_4_ = auVar187._28_4_ + auVar161._28_4_;
                        fVar9 = local_2d60._0_4_;
                        auVar180._0_4_ = auVar119._0_4_ + fVar9;
                        fVar10 = local_2d60._4_4_;
                        auVar180._4_4_ = auVar119._4_4_ + fVar10;
                        fVar11 = local_2d60._8_4_;
                        auVar180._8_4_ = auVar119._8_4_ + fVar11;
                        fVar12 = local_2d60._12_4_;
                        auVar180._12_4_ = auVar119._12_4_ + fVar12;
                        fVar13 = local_2d60._16_4_;
                        auVar180._16_4_ = auVar119._16_4_ + fVar13;
                        fVar14 = local_2d60._20_4_;
                        auVar180._20_4_ = auVar119._20_4_ + fVar14;
                        fVar15 = local_2d60._24_4_;
                        auVar180._24_4_ = auVar119._24_4_ + fVar15;
                        fVar124 = auVar119._28_4_;
                        auVar180._28_4_ = fVar124 + local_2d60._28_4_;
                        auVar173._0_4_ = auVar148._0_4_ * local_2d80._0_4_;
                        auVar173._4_4_ = auVar148._4_4_ * local_2d80._4_4_;
                        auVar173._8_4_ = auVar148._8_4_ * local_2d80._8_4_;
                        auVar173._12_4_ = auVar148._12_4_ * local_2d80._12_4_;
                        auVar173._16_4_ = auVar148._16_4_ * local_2d80._16_4_;
                        auVar173._20_4_ = auVar148._20_4_ * local_2d80._20_4_;
                        auVar173._28_36_ = auVar198._28_36_;
                        auVar173._24_4_ = auVar148._24_4_ * local_2d80._24_4_;
                        auVar135 = vfmsub231ps_fma(auVar173._0_32_,auVar193,auVar180);
                        auVar97 = vsubps_avx(local_2640,auVar120);
                        auVar20 = vsubps_avx(auVar97,auVar160);
                        auVar24._4_4_ = auVar180._4_4_ * auVar20._4_4_;
                        auVar24._0_4_ = auVar180._0_4_ * auVar20._0_4_;
                        auVar24._8_4_ = auVar180._8_4_ * auVar20._8_4_;
                        auVar24._12_4_ = auVar180._12_4_ * auVar20._12_4_;
                        auVar24._16_4_ = auVar180._16_4_ * auVar20._16_4_;
                        auVar24._20_4_ = auVar180._20_4_ * auVar20._20_4_;
                        auVar24._24_4_ = auVar180._24_4_ * auVar20._24_4_;
                        auVar24._28_4_ = auVar156._28_4_;
                        auVar181._0_4_ = auVar97._0_4_ + auVar160._0_4_;
                        auVar181._4_4_ = auVar97._4_4_ + auVar160._4_4_;
                        auVar181._8_4_ = auVar97._8_4_ + auVar160._8_4_;
                        auVar181._12_4_ = auVar97._12_4_ + auVar160._12_4_;
                        auVar181._16_4_ = auVar97._16_4_ + auVar160._16_4_;
                        auVar181._20_4_ = auVar97._20_4_ + auVar160._20_4_;
                        auVar181._24_4_ = auVar97._24_4_ + auVar160._24_4_;
                        auVar181._28_4_ = auVar97._28_4_ + auVar160._28_4_;
                        auVar108 = vfmsub231ps_fma(auVar24,local_2d80,auVar181);
                        auVar25._4_4_ = auVar181._4_4_ * auVar193._4_4_;
                        auVar25._0_4_ = auVar181._0_4_ * auVar193._0_4_;
                        auVar25._8_4_ = auVar181._8_4_ * auVar193._8_4_;
                        auVar25._12_4_ = auVar181._12_4_ * auVar193._12_4_;
                        auVar25._16_4_ = auVar181._16_4_ * auVar193._16_4_;
                        auVar25._20_4_ = auVar181._20_4_ * auVar193._20_4_;
                        auVar25._24_4_ = auVar181._24_4_ * auVar193._24_4_;
                        auVar25._28_4_ = auVar181._28_4_;
                        auVar179 = vfmsub231ps_fma(auVar25,auVar20,auVar148);
                        pRVar2 = ray + 0xc0;
                        fVar123 = *(float *)pRVar2;
                        fVar125 = *(float *)(ray + 0xc4);
                        fVar127 = *(float *)(ray + 200);
                        fVar129 = *(float *)(ray + 0xcc);
                        fVar131 = *(float *)(ray + 0xd0);
                        fVar133 = *(float *)(ray + 0xd4);
                        fVar107 = *(float *)(ray + 0xd8);
                        auVar72 = *(undefined1 (*) [28])pRVar2;
                        auVar26._4_4_ = auVar179._4_4_ * fVar125;
                        auVar26._0_4_ = auVar179._0_4_ * fVar123;
                        auVar26._8_4_ = auVar179._8_4_ * fVar127;
                        auVar26._12_4_ = auVar179._12_4_ * fVar129;
                        auVar26._16_4_ = fVar131 * 0.0;
                        auVar26._20_4_ = fVar133 * 0.0;
                        auVar26._24_4_ = fVar107 * 0.0;
                        auVar26._28_4_ = auVar148._28_4_;
                        auVar99 = *(undefined1 (*) [32])(ray + 0xa0);
                        auVar108 = vfmadd231ps_fma(auVar26,auVar99,ZEXT1632(auVar108));
                        local_2be0 = *(undefined1 (*) [32])(ray + 0x80);
                        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_2be0,ZEXT1632(auVar135))
                        ;
                        uVar91 = *(undefined4 *)(local_2cc8 + lVar90 * 4);
                        local_26a0._4_4_ = uVar91;
                        local_26a0._0_4_ = uVar91;
                        local_26a0._8_4_ = uVar91;
                        local_26a0._12_4_ = uVar91;
                        local_26a0._16_4_ = uVar91;
                        local_26a0._20_4_ = uVar91;
                        local_26a0._24_4_ = uVar91;
                        local_26a0._28_4_ = uVar91;
                        auVar120 = vsubps_avx(local_26a0,auVar120);
                        uVar91 = *(undefined4 *)(local_2cd8 + lVar90 * 4);
                        local_26c0._4_4_ = uVar91;
                        local_26c0._0_4_ = uVar91;
                        local_26c0._8_4_ = uVar91;
                        local_26c0._12_4_ = uVar91;
                        local_26c0._16_4_ = uVar91;
                        local_26c0._20_4_ = uVar91;
                        local_26c0._24_4_ = uVar91;
                        local_26c0._28_4_ = uVar91;
                        uVar91 = *(undefined4 *)(local_2cd0 + lVar90 * 4);
                        local_26e0._4_4_ = uVar91;
                        local_26e0._0_4_ = uVar91;
                        local_26e0._8_4_ = uVar91;
                        local_26e0._12_4_ = uVar91;
                        local_26e0._16_4_ = uVar91;
                        local_26e0._20_4_ = uVar91;
                        local_26e0._24_4_ = uVar91;
                        local_26e0._28_4_ = uVar91;
                        auVar98 = vsubps_avx(local_26c0,auVar98);
                        auVar156 = vsubps_avx(local_26e0,auVar156);
                        local_2c00 = vsubps_avx(auVar161,auVar98);
                        local_2c20 = vsubps_avx(local_2d60,auVar156);
                        auVar174._0_4_ = auVar161._0_4_ + auVar98._0_4_;
                        auVar174._4_4_ = auVar161._4_4_ + auVar98._4_4_;
                        auVar174._8_4_ = auVar161._8_4_ + auVar98._8_4_;
                        auVar174._12_4_ = auVar161._12_4_ + auVar98._12_4_;
                        auVar174._16_4_ = auVar161._16_4_ + auVar98._16_4_;
                        auVar174._20_4_ = auVar161._20_4_ + auVar98._20_4_;
                        auVar174._24_4_ = auVar161._24_4_ + auVar98._24_4_;
                        auVar174._28_4_ = auVar161._28_4_ + auVar98._28_4_;
                        auVar195._0_4_ = fVar9 + auVar156._0_4_;
                        auVar195._4_4_ = fVar10 + auVar156._4_4_;
                        auVar195._8_4_ = fVar11 + auVar156._8_4_;
                        auVar195._12_4_ = fVar12 + auVar156._12_4_;
                        auVar195._16_4_ = fVar13 + auVar156._16_4_;
                        auVar195._20_4_ = fVar14 + auVar156._20_4_;
                        auVar195._24_4_ = fVar15 + auVar156._24_4_;
                        fVar106 = auVar156._28_4_;
                        auVar195._28_4_ = local_2d60._28_4_ + fVar106;
                        fVar197 = local_2c20._0_4_;
                        fVar199 = local_2c20._4_4_;
                        auVar27._4_4_ = fVar199 * auVar174._4_4_;
                        auVar27._0_4_ = fVar197 * auVar174._0_4_;
                        fVar200 = local_2c20._8_4_;
                        auVar27._8_4_ = fVar200 * auVar174._8_4_;
                        fVar201 = local_2c20._12_4_;
                        auVar27._12_4_ = fVar201 * auVar174._12_4_;
                        fVar202 = local_2c20._16_4_;
                        auVar27._16_4_ = fVar202 * auVar174._16_4_;
                        fVar203 = local_2c20._20_4_;
                        auVar27._20_4_ = fVar203 * auVar174._20_4_;
                        fVar204 = local_2c20._24_4_;
                        auVar27._24_4_ = fVar204 * auVar174._24_4_;
                        auVar27._28_4_ = fVar124;
                        auVar179 = vfmsub231ps_fma(auVar27,local_2c00,auVar195);
                        auVar153 = vsubps_avx(auVar160,auVar120);
                        fVar103 = auVar153._0_4_;
                        fVar104 = auVar153._4_4_;
                        auVar28._4_4_ = auVar195._4_4_ * fVar104;
                        auVar28._0_4_ = auVar195._0_4_ * fVar103;
                        fVar105 = auVar153._8_4_;
                        auVar28._8_4_ = auVar195._8_4_ * fVar105;
                        fVar16 = auVar153._12_4_;
                        auVar28._12_4_ = auVar195._12_4_ * fVar16;
                        fVar17 = auVar153._16_4_;
                        auVar28._16_4_ = auVar195._16_4_ * fVar17;
                        fVar18 = auVar153._20_4_;
                        auVar28._20_4_ = auVar195._20_4_ * fVar18;
                        fVar19 = auVar153._24_4_;
                        auVar28._24_4_ = auVar195._24_4_ * fVar19;
                        auVar28._28_4_ = auVar195._28_4_;
                        auVar168._0_4_ = auVar160._0_4_ + auVar120._0_4_;
                        auVar168._4_4_ = auVar160._4_4_ + auVar120._4_4_;
                        auVar168._8_4_ = auVar160._8_4_ + auVar120._8_4_;
                        auVar168._12_4_ = auVar160._12_4_ + auVar120._12_4_;
                        auVar168._16_4_ = auVar160._16_4_ + auVar120._16_4_;
                        auVar168._20_4_ = auVar160._20_4_ + auVar120._20_4_;
                        auVar168._24_4_ = auVar160._24_4_ + auVar120._24_4_;
                        auVar168._28_4_ = auVar160._28_4_ + auVar120._28_4_;
                        auVar135 = vfmsub231ps_fma(auVar28,local_2c20,auVar168);
                        fVar126 = local_2c00._0_4_;
                        fVar128 = local_2c00._4_4_;
                        auVar29._4_4_ = fVar128 * auVar168._4_4_;
                        auVar29._0_4_ = fVar126 * auVar168._0_4_;
                        fVar130 = local_2c00._8_4_;
                        auVar29._8_4_ = fVar130 * auVar168._8_4_;
                        fVar132 = local_2c00._12_4_;
                        auVar29._12_4_ = fVar132 * auVar168._12_4_;
                        fVar134 = local_2c00._16_4_;
                        auVar29._16_4_ = fVar134 * auVar168._16_4_;
                        fVar159 = local_2c00._20_4_;
                        auVar29._20_4_ = fVar159 * auVar168._20_4_;
                        fVar192 = local_2c00._24_4_;
                        auVar29._24_4_ = fVar192 * auVar168._24_4_;
                        auVar29._28_4_ = auVar168._28_4_;
                        auVar21 = vfmsub231ps_fma(auVar29,auVar153,auVar174);
                        auVar30._4_4_ = fVar125 * auVar21._4_4_;
                        auVar30._0_4_ = fVar123 * auVar21._0_4_;
                        auVar30._8_4_ = fVar127 * auVar21._8_4_;
                        auVar30._12_4_ = fVar129 * auVar21._12_4_;
                        auVar30._16_4_ = fVar131 * 0.0;
                        auVar30._20_4_ = fVar133 * 0.0;
                        auVar30._24_4_ = fVar107 * 0.0;
                        auVar30._28_4_ = auVar174._28_4_;
                        auVar135 = vfmadd231ps_fma(auVar30,auVar99,ZEXT1632(auVar135));
                        auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),local_2be0,ZEXT1632(auVar179))
                        ;
                        auVar164 = vsubps_avx(auVar120,auVar97);
                        auVar95._0_4_ = auVar97._0_4_ + auVar120._0_4_;
                        auVar95._4_4_ = auVar97._4_4_ + auVar120._4_4_;
                        auVar95._8_4_ = auVar97._8_4_ + auVar120._8_4_;
                        auVar95._12_4_ = auVar97._12_4_ + auVar120._12_4_;
                        auVar95._16_4_ = auVar97._16_4_ + auVar120._16_4_;
                        auVar95._20_4_ = auVar97._20_4_ + auVar120._20_4_;
                        auVar95._24_4_ = auVar97._24_4_ + auVar120._24_4_;
                        auVar95._28_4_ = auVar97._28_4_ + auVar120._28_4_;
                        auVar97 = vsubps_avx(auVar98,auVar187);
                        auVar116._0_4_ = auVar187._0_4_ + auVar98._0_4_;
                        auVar116._4_4_ = auVar187._4_4_ + auVar98._4_4_;
                        auVar116._8_4_ = auVar187._8_4_ + auVar98._8_4_;
                        auVar116._12_4_ = auVar187._12_4_ + auVar98._12_4_;
                        auVar116._16_4_ = auVar187._16_4_ + auVar98._16_4_;
                        auVar116._20_4_ = auVar187._20_4_ + auVar98._20_4_;
                        auVar116._24_4_ = auVar187._24_4_ + auVar98._24_4_;
                        auVar116._28_4_ = auVar187._28_4_ + auVar98._28_4_;
                        auVar187 = vsubps_avx(auVar156,auVar119);
                        auVar137._0_4_ = auVar156._0_4_ + auVar119._0_4_;
                        auVar137._4_4_ = auVar156._4_4_ + auVar119._4_4_;
                        auVar137._8_4_ = auVar156._8_4_ + auVar119._8_4_;
                        auVar137._12_4_ = auVar156._12_4_ + auVar119._12_4_;
                        auVar137._16_4_ = auVar156._16_4_ + auVar119._16_4_;
                        auVar137._20_4_ = auVar156._20_4_ + auVar119._20_4_;
                        auVar137._24_4_ = auVar156._24_4_ + auVar119._24_4_;
                        auVar137._28_4_ = fVar106 + fVar124;
                        auVar31._4_4_ = auVar187._4_4_ * auVar116._4_4_;
                        auVar31._0_4_ = auVar187._0_4_ * auVar116._0_4_;
                        auVar31._8_4_ = auVar187._8_4_ * auVar116._8_4_;
                        auVar31._12_4_ = auVar187._12_4_ * auVar116._12_4_;
                        auVar31._16_4_ = auVar187._16_4_ * auVar116._16_4_;
                        auVar31._20_4_ = auVar187._20_4_ * auVar116._20_4_;
                        auVar31._24_4_ = auVar187._24_4_ * auVar116._24_4_;
                        auVar31._28_4_ = fVar106;
                        auVar21 = vfmsub231ps_fma(auVar31,auVar97,auVar137);
                        auVar32._4_4_ = auVar164._4_4_ * auVar137._4_4_;
                        auVar32._0_4_ = auVar164._0_4_ * auVar137._0_4_;
                        auVar32._8_4_ = auVar164._8_4_ * auVar137._8_4_;
                        auVar32._12_4_ = auVar164._12_4_ * auVar137._12_4_;
                        auVar32._16_4_ = auVar164._16_4_ * auVar137._16_4_;
                        auVar32._20_4_ = auVar164._20_4_ * auVar137._20_4_;
                        auVar32._24_4_ = auVar164._24_4_ * auVar137._24_4_;
                        auVar32._28_4_ = auVar137._28_4_;
                        auVar179 = vfmsub231ps_fma(auVar32,auVar187,auVar95);
                        auVar33._4_4_ = auVar97._4_4_ * auVar95._4_4_;
                        auVar33._0_4_ = auVar97._0_4_ * auVar95._0_4_;
                        auVar33._8_4_ = auVar97._8_4_ * auVar95._8_4_;
                        auVar33._12_4_ = auVar97._12_4_ * auVar95._12_4_;
                        auVar33._16_4_ = auVar97._16_4_ * auVar95._16_4_;
                        auVar33._20_4_ = auVar97._20_4_ * auVar95._20_4_;
                        auVar33._24_4_ = auVar97._24_4_ * auVar95._24_4_;
                        auVar33._28_4_ = auVar95._28_4_;
                        auVar22 = vfmsub231ps_fma(auVar33,auVar164,auVar116);
                        auVar96._0_4_ = fVar123 * auVar22._0_4_;
                        auVar96._4_4_ = fVar125 * auVar22._4_4_;
                        auVar96._8_4_ = fVar127 * auVar22._8_4_;
                        auVar96._12_4_ = fVar129 * auVar22._12_4_;
                        auVar96._16_4_ = fVar131 * 0.0;
                        auVar96._20_4_ = fVar133 * 0.0;
                        auVar96._24_4_ = fVar107 * 0.0;
                        auVar96._28_4_ = 0;
                        auVar179 = vfmadd231ps_fma(auVar96,auVar99,ZEXT1632(auVar179));
                        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),local_2be0,ZEXT1632(auVar21));
                        auVar162 = ZEXT1632(CONCAT412(auVar179._12_4_ +
                                                      auVar108._12_4_ + auVar135._12_4_,
                                                      CONCAT48(auVar179._8_4_ +
                                                               auVar108._8_4_ + auVar135._8_4_,
                                                               CONCAT44(auVar179._4_4_ +
                                                                        auVar108._4_4_ +
                                                                        auVar135._4_4_,
                                                                        auVar179._0_4_ +
                                                                        auVar108._0_4_ +
                                                                        auVar135._0_4_))));
                        auVar120 = vandps_avx(auVar162,local_2c80);
                        fVar106 = auVar120._0_4_ * 1.1920929e-07;
                        fVar123 = auVar120._4_4_ * 1.1920929e-07;
                        auVar34._4_4_ = fVar123;
                        auVar34._0_4_ = fVar106;
                        fVar125 = auVar120._8_4_ * 1.1920929e-07;
                        auVar34._8_4_ = fVar125;
                        fVar127 = auVar120._12_4_ * 1.1920929e-07;
                        auVar34._12_4_ = fVar127;
                        fVar129 = auVar120._16_4_ * 1.1920929e-07;
                        auVar34._16_4_ = fVar129;
                        fVar131 = auVar120._20_4_ * 1.1920929e-07;
                        auVar34._20_4_ = fVar131;
                        fVar133 = auVar120._24_4_ * 1.1920929e-07;
                        auVar34._24_4_ = fVar133;
                        auVar34._28_4_ = auVar120._28_4_;
                        auVar149 = ZEXT1632(auVar108);
                        auVar98 = vminps_avx(auVar149,ZEXT1632(auVar135));
                        auVar98 = vminps_avx(auVar98,ZEXT1632(auVar179));
                        auVar157._0_8_ = CONCAT44(fVar123,fVar106) ^ 0x8000000080000000;
                        auVar157._8_4_ = -fVar125;
                        auVar157._12_4_ = -fVar127;
                        auVar157._16_4_ = -fVar129;
                        auVar157._20_4_ = -fVar131;
                        auVar157._24_4_ = -fVar133;
                        auVar157._28_4_ = auVar120._28_4_ ^ 0x80000000;
                        auVar98 = vcmpps_avx(auVar98,auVar157,5);
                        auVar156 = vmaxps_avx(auVar149,ZEXT1632(auVar135));
                        auVar120 = vmaxps_avx(auVar156,ZEXT1632(auVar179));
                        auVar120 = vcmpps_avx(auVar120,auVar34,2);
                        auVar120 = vorps_avx(auVar98,auVar120);
                        auVar119 = auVar93 & auVar120;
                        auVar120 = vandps_avx(auVar120,auVar93);
                        local_2e00._8_4_ = 0x80000000;
                        local_2e00._0_8_ = 0x8000000080000000;
                        local_2e00._12_4_ = 0x80000000;
                        local_2e00._16_4_ = 0x80000000;
                        local_2e00._20_4_ = 0x80000000;
                        local_2e00._24_4_ = 0x80000000;
                        local_2e00._28_4_ = 0x80000000;
                        auVar23 = local_2c00;
                        if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar119 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar119 >> 0x7f,0) != '\0')
                              || (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar119 >> 0xbf,0) != '\0') ||
                            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar119[0x1f] < '\0') {
                          auVar35._4_4_ = fVar128 * local_2d80._4_4_;
                          auVar35._0_4_ = fVar126 * local_2d80._0_4_;
                          auVar35._8_4_ = fVar130 * local_2d80._8_4_;
                          auVar35._12_4_ = fVar132 * local_2d80._12_4_;
                          auVar35._16_4_ = fVar134 * local_2d80._16_4_;
                          auVar35._20_4_ = fVar159 * local_2d80._20_4_;
                          auVar35._24_4_ = fVar192 * local_2d80._24_4_;
                          auVar35._28_4_ = auVar120._28_4_;
                          auVar150._0_4_ = fVar103 * auVar193._0_4_;
                          auVar150._4_4_ = fVar104 * auVar193._4_4_;
                          auVar150._8_4_ = fVar105 * auVar193._8_4_;
                          auVar150._12_4_ = fVar16 * auVar193._12_4_;
                          auVar150._16_4_ = fVar17 * auVar193._16_4_;
                          auVar150._20_4_ = fVar18 * auVar193._20_4_;
                          auVar150._24_4_ = fVar19 * auVar193._24_4_;
                          auVar150._28_4_ = 0;
                          auVar179 = vfmsub213ps_fma(auVar193,local_2c20,auVar35);
                          auVar36._4_4_ = auVar97._4_4_ * fVar199;
                          auVar36._0_4_ = auVar97._0_4_ * fVar197;
                          auVar36._8_4_ = auVar97._8_4_ * fVar200;
                          auVar36._12_4_ = auVar97._12_4_ * fVar201;
                          auVar36._16_4_ = auVar97._16_4_ * fVar202;
                          auVar36._20_4_ = auVar97._20_4_ * fVar203;
                          auVar36._24_4_ = auVar97._24_4_ * fVar204;
                          auVar36._28_4_ = auVar98._28_4_;
                          auVar37._4_4_ = auVar187._4_4_ * fVar104;
                          auVar37._0_4_ = auVar187._0_4_ * fVar103;
                          auVar37._8_4_ = auVar187._8_4_ * fVar105;
                          auVar37._12_4_ = auVar187._12_4_ * fVar16;
                          auVar37._16_4_ = auVar187._16_4_ * fVar17;
                          auVar37._20_4_ = auVar187._20_4_ * fVar18;
                          auVar37._24_4_ = auVar187._24_4_ * fVar19;
                          auVar37._28_4_ = auVar156._28_4_;
                          auVar21 = vfmsub213ps_fma(auVar187,local_2c00,auVar36);
                          auVar98 = vandps_avx(auVar35,local_2c80);
                          auVar156 = vandps_avx(auVar36,local_2c80);
                          auVar98 = vcmpps_avx(auVar98,auVar156,1);
                          auVar187 = vblendvps_avx(ZEXT1632(auVar21),ZEXT1632(auVar179),auVar98);
                          auVar38._4_4_ = auVar164._4_4_ * fVar128;
                          auVar38._0_4_ = auVar164._0_4_ * fVar126;
                          auVar38._8_4_ = auVar164._8_4_ * fVar130;
                          auVar38._12_4_ = auVar164._12_4_ * fVar132;
                          auVar38._16_4_ = auVar164._16_4_ * fVar134;
                          auVar38._20_4_ = auVar164._20_4_ * fVar159;
                          auVar38._24_4_ = auVar164._24_4_ * fVar192;
                          auVar38._28_4_ = auVar98._28_4_;
                          auVar179 = vfmsub213ps_fma(auVar164,local_2c20,auVar37);
                          auVar163._0_4_ = auVar20._0_4_ * fVar197;
                          auVar163._4_4_ = auVar20._4_4_ * fVar199;
                          auVar163._8_4_ = auVar20._8_4_ * fVar200;
                          auVar163._12_4_ = auVar20._12_4_ * fVar201;
                          auVar163._16_4_ = auVar20._16_4_ * fVar202;
                          auVar163._20_4_ = auVar20._20_4_ * fVar203;
                          auVar163._24_4_ = auVar20._24_4_ * fVar204;
                          auVar163._28_4_ = 0;
                          auVar21 = vfmsub213ps_fma(local_2d80,auVar153,auVar163);
                          auVar98 = vandps_avx(auVar163,local_2c80);
                          auVar156 = vandps_avx(auVar37,local_2c80);
                          auVar98 = vcmpps_avx(auVar98,auVar156,1);
                          auVar119 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar21),auVar98);
                          auVar179 = vfmsub213ps_fma(auVar20,local_2c00,auVar150);
                          auVar21 = vfmsub213ps_fma(auVar97,auVar153,auVar38);
                          auVar98 = vandps_avx(auVar150,local_2c80);
                          auVar156 = vandps_avx(auVar38,local_2c80);
                          auVar97 = vcmpps_avx(auVar98,auVar156,1);
                          auVar156 = vblendvps_avx(ZEXT1632(auVar21),ZEXT1632(auVar179),auVar97);
                          local_2ca0._0_4_ = auVar72._0_4_;
                          local_2ca0._4_4_ = auVar72._4_4_;
                          fStack_2c98 = auVar72._8_4_;
                          fStack_2c94 = auVar72._12_4_;
                          fStack_2c90 = auVar72._16_4_;
                          fStack_2c8c = auVar72._20_4_;
                          fStack_2c88 = auVar72._24_4_;
                          auVar39._4_4_ = auVar156._4_4_ * (float)local_2ca0._4_4_;
                          auVar39._0_4_ = auVar156._0_4_ * (float)local_2ca0._0_4_;
                          auVar39._8_4_ = auVar156._8_4_ * fStack_2c98;
                          auVar39._12_4_ = auVar156._12_4_ * fStack_2c94;
                          auVar39._16_4_ = auVar156._16_4_ * fStack_2c90;
                          auVar39._20_4_ = auVar156._20_4_ * fStack_2c8c;
                          auVar39._24_4_ = auVar156._24_4_ * fStack_2c88;
                          auVar39._28_4_ = auVar97._28_4_;
                          auVar179 = vfmadd213ps_fma(auVar99,auVar119,auVar39);
                          auVar179 = vfmadd213ps_fma(local_2be0,auVar187,ZEXT1632(auVar179));
                          fVar106 = auVar179._0_4_ + auVar179._0_4_;
                          fVar103 = auVar179._4_4_ + auVar179._4_4_;
                          fVar104 = auVar179._8_4_ + auVar179._8_4_;
                          fVar105 = auVar179._12_4_ + auVar179._12_4_;
                          auVar97 = ZEXT1632(CONCAT412(fVar105,CONCAT48(fVar104,CONCAT44(fVar103,
                                                  fVar106))));
                          auVar40._4_4_ = auVar156._4_4_ * fVar10;
                          auVar40._0_4_ = auVar156._0_4_ * fVar9;
                          auVar40._8_4_ = auVar156._8_4_ * fVar11;
                          auVar40._12_4_ = auVar156._12_4_ * fVar12;
                          auVar40._16_4_ = auVar156._16_4_ * fVar13;
                          auVar40._20_4_ = auVar156._20_4_ * fVar14;
                          auVar40._24_4_ = auVar156._24_4_ * fVar15;
                          auVar40._28_4_ = auVar98._28_4_;
                          auVar179 = vfmadd213ps_fma(auVar161,auVar119,auVar40);
                          auVar21 = vfmadd213ps_fma(auVar160,auVar187,ZEXT1632(auVar179));
                          auVar98 = vrcpps_avx(auVar97);
                          auVar188._8_4_ = 0x3f800000;
                          auVar188._0_8_ = 0x3f8000003f800000;
                          auVar188._12_4_ = 0x3f800000;
                          auVar188._16_4_ = 0x3f800000;
                          auVar188._20_4_ = 0x3f800000;
                          auVar188._24_4_ = 0x3f800000;
                          auVar188._28_4_ = 0x3f800000;
                          auVar179 = vfnmadd213ps_fma(auVar98,auVar97,auVar188);
                          auVar179 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar98,auVar98);
                          auVar160 = ZEXT1632(CONCAT412(auVar179._12_4_ *
                                                        (auVar21._12_4_ + auVar21._12_4_),
                                                        CONCAT48(auVar179._8_4_ *
                                                                 (auVar21._8_4_ + auVar21._8_4_),
                                                                 CONCAT44(auVar179._4_4_ *
                                                                          (auVar21._4_4_ +
                                                                          auVar21._4_4_),
                                                                          auVar179._0_4_ *
                                                                          (auVar21._0_4_ +
                                                                          auVar21._0_4_)))));
                          auVar98 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar160,2);
                          auVar99 = vcmpps_avx(auVar160,*(undefined1 (*) [32])(ray + 0x100),2);
                          auVar98 = vandps_avx(auVar99,auVar98);
                          auVar182._0_8_ = CONCAT44(fVar103,fVar106) ^ 0x8000000080000000;
                          auVar182._8_4_ = -fVar104;
                          auVar182._12_4_ = -fVar105;
                          auVar182._16_4_ = 0x80000000;
                          auVar182._20_4_ = 0x80000000;
                          auVar182._24_4_ = 0x80000000;
                          auVar182._28_4_ = 0x80000000;
                          auVar99 = vcmpps_avx(auVar182,auVar97,4);
                          auVar98 = vandps_avx(auVar99,auVar98);
                          auVar98 = vpslld_avx2(auVar98,0x1f);
                          auVar99 = vpsrad_avx2(auVar98,0x1f);
                          auVar98 = auVar120 & auVar99;
                          auVar120 = vandps_avx(auVar120,auVar99);
                          auVar23 = local_2e00;
                          local_2c60 = auVar162;
                          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar98 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar98 >> 0x7f,0) != '\0') ||
                                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar98 >> 0xbf,0) != '\0') ||
                              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar98[0x1f] < '\0') {
                            local_2c40 = auVar108._0_8_;
                            uStack_2c38 = auVar108._8_8_;
                            local_2700 = local_2c40;
                            uStack_26f8 = uStack_2c38;
                            uStack_26f0 = 0;
                            uStack_26e8 = 0;
                            local_27c0 = auVar156;
                            local_27a0 = auVar119;
                            local_2780 = auVar187;
                            local_2760 = auVar160;
                            local_2740 = auVar162;
                            _local_2720 = ZEXT1632(auVar135);
                          }
                        }
                        auVar190 = ZEXT3264(auVar23);
                        auVar173 = ZEXT3264(local_2c80);
                        auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        uVar91 = *(undefined4 *)(pGVar74 + lVar90 * 4 + lVar92);
                        auVar205._4_4_ = uVar91;
                        auVar205._0_4_ = uVar91;
                        auVar205._8_4_ = uVar91;
                        auVar205._12_4_ = uVar91;
                        auVar205._16_4_ = uVar91;
                        auVar205._20_4_ = uVar91;
                        auVar205._24_4_ = uVar91;
                        auVar205._28_4_ = uVar91;
                        uVar91 = *(undefined4 *)(pGVar76 + lVar90 * 4 + lVar92);
                        local_2da0._4_4_ = uVar91;
                        local_2da0._0_4_ = uVar91;
                        local_2da0._8_4_ = uVar91;
                        local_2da0._12_4_ = uVar91;
                        local_2da0._16_4_ = uVar91;
                        local_2da0._20_4_ = uVar91;
                        local_2da0._24_4_ = uVar91;
                        local_2da0._28_4_ = uVar91;
                        auVar198 = ZEXT3264(local_2da0);
                        uVar91 = *(undefined4 *)(pGVar77 + lVar90 * 4 + lVar92);
                        local_2dc0._4_4_ = uVar91;
                        local_2dc0._0_4_ = uVar91;
                        local_2dc0._8_4_ = uVar91;
                        local_2dc0._12_4_ = uVar91;
                        local_2dc0._16_4_ = uVar91;
                        local_2dc0._20_4_ = uVar91;
                        local_2dc0._24_4_ = uVar91;
                        local_2dc0._28_4_ = uVar91;
                        auVar185 = ZEXT3264(local_2dc0);
                        uVar6 = *(uint *)(local_2e40.super_Precalculations.grid + 0x18);
                        pGVar7 = (context->scene->geometries).items[uVar6].ptr;
                        uVar3 = pGVar7->mask;
                        auVar117._4_4_ = uVar3;
                        auVar117._0_4_ = uVar3;
                        auVar117._8_4_ = uVar3;
                        auVar117._12_4_ = uVar3;
                        auVar117._16_4_ = uVar3;
                        auVar117._20_4_ = uVar3;
                        auVar117._24_4_ = uVar3;
                        auVar117._28_4_ = uVar3;
                        auVar98 = vpand_avx2(auVar117,*(undefined1 (*) [32])(ray + 0x120));
                        auVar156 = vpcmpeqd_avx2(auVar98,_DAT_01faff00);
                        auVar98 = auVar120 & ~auVar156;
                        local_2de0 = auVar93;
                        _local_2ca0 = *(undefined1 (*) [32])pRVar2;
                        _local_2c40 = auVar149;
                        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar98 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar98 >> 0x7f,0) != '\0') ||
                              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar98 >> 0xbf,0) != '\0') ||
                            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar98[0x1f] < '\0') {
                          uVar91 = *(undefined4 *)(local_2e40.super_Precalculations.grid + 0x1c);
                          auVar93 = vandnps_avx(auVar156,auVar120);
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar120 = vandps_avx(local_2740,local_2c80);
                            auVar98 = vrcpps_avx(local_2740);
                            auVar171._8_4_ = 0x3f800000;
                            auVar171._0_8_ = 0x3f8000003f800000;
                            auVar171._12_4_ = 0x3f800000;
                            auVar171._16_4_ = 0x3f800000;
                            auVar171._20_4_ = 0x3f800000;
                            auVar171._24_4_ = 0x3f800000;
                            auVar171._28_4_ = 0x3f800000;
                            auVar108 = vfnmadd213ps_fma(auVar98,local_2740,auVar171);
                            auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar98,auVar98);
                            auVar139._8_4_ = 0x219392ef;
                            auVar139._0_8_ = 0x219392ef219392ef;
                            auVar139._12_4_ = 0x219392ef;
                            auVar139._16_4_ = 0x219392ef;
                            auVar139._20_4_ = 0x219392ef;
                            auVar139._24_4_ = 0x219392ef;
                            auVar139._28_4_ = 0x219392ef;
                            auVar98 = vcmpps_avx(auVar120,auVar139,5);
                            auVar120 = vandps_avx(auVar98,ZEXT1632(auVar108));
                            auVar57._4_4_ = auVar120._4_4_ * local_2700._4_4_;
                            auVar57._0_4_ = auVar120._0_4_ * (float)local_2700;
                            auVar57._8_4_ = auVar120._8_4_ * (float)uStack_26f8;
                            auVar57._12_4_ = auVar120._12_4_ * uStack_26f8._4_4_;
                            auVar57._16_4_ = auVar120._16_4_ * (float)uStack_26f0;
                            auVar57._20_4_ = auVar120._20_4_ * uStack_26f0._4_4_;
                            auVar57._24_4_ = auVar120._24_4_ * (float)uStack_26e8;
                            auVar57._28_4_ = auVar98._28_4_;
                            auVar156 = vminps_avx(auVar57,auVar171);
                            auVar58._4_4_ = auVar120._4_4_ * (float)local_2720._4_4_;
                            auVar58._0_4_ = auVar120._0_4_ * (float)local_2720._0_4_;
                            auVar58._8_4_ = auVar120._8_4_ * fStack_2718;
                            auVar58._12_4_ = auVar120._12_4_ * fStack_2714;
                            auVar58._16_4_ = auVar120._16_4_ * fStack_2710;
                            auVar58._20_4_ = auVar120._20_4_ * fStack_270c;
                            auVar58._24_4_ = auVar120._24_4_ * fStack_2708;
                            auVar58._28_4_ = auVar120._28_4_;
                            auVar99 = vminps_avx(auVar58,auVar171);
                            uVar4 = *(undefined4 *)(pGVar78 + lVar90 * 4 + lVar82 + -4);
                            auVar154._4_4_ = uVar4;
                            auVar154._0_4_ = uVar4;
                            auVar154._8_4_ = uVar4;
                            auVar154._12_4_ = uVar4;
                            auVar154._16_4_ = uVar4;
                            auVar154._20_4_ = uVar4;
                            auVar154._24_4_ = uVar4;
                            auVar154._28_4_ = uVar4;
                            auVar98 = vpsrld_avx2(auVar154,0x10);
                            auVar161 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                            auVar120 = vpblendw_avx2(auVar154,auVar161,0xaa);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar98 = vcvtdq2ps_avx(auVar98);
                            uVar4 = *(undefined4 *)(pGVar75 + lVar90 * 4 + lVar92);
                            auVar166._4_4_ = uVar4;
                            auVar166._0_4_ = uVar4;
                            auVar166._8_4_ = uVar4;
                            auVar166._12_4_ = uVar4;
                            auVar166._16_4_ = uVar4;
                            auVar166._20_4_ = uVar4;
                            auVar166._24_4_ = uVar4;
                            auVar166._28_4_ = uVar4;
                            auVar160 = vsubps_avx(auVar171,auVar156);
                            auVar160 = vsubps_avx(auVar160,auVar99);
                            auVar173 = ZEXT3264(auVar160);
                            auVar176._0_4_ = auVar160._0_4_ * auVar120._0_4_ * 0.00012207031;
                            auVar176._4_4_ = auVar160._4_4_ * auVar120._4_4_ * 0.00012207031;
                            auVar176._8_4_ = auVar160._8_4_ * auVar120._8_4_ * 0.00012207031;
                            auVar176._12_4_ = auVar160._12_4_ * auVar120._12_4_ * 0.00012207031;
                            auVar176._16_4_ = auVar160._16_4_ * auVar120._16_4_ * 0.00012207031;
                            auVar176._20_4_ = auVar160._20_4_ * auVar120._20_4_ * 0.00012207031;
                            auVar176._24_4_ = auVar160._24_4_ * auVar120._24_4_ * 0.00012207031;
                            auVar176._28_4_ = 0;
                            auVar59._4_4_ = auVar160._4_4_ * auVar98._4_4_ * 0.00012207031;
                            auVar59._0_4_ = auVar160._0_4_ * auVar98._0_4_ * 0.00012207031;
                            auVar59._8_4_ = auVar160._8_4_ * auVar98._8_4_ * 0.00012207031;
                            auVar59._12_4_ = auVar160._12_4_ * auVar98._12_4_ * 0.00012207031;
                            auVar59._16_4_ = auVar160._16_4_ * auVar98._16_4_ * 0.00012207031;
                            auVar59._20_4_ = auVar160._20_4_ * auVar98._20_4_ * 0.00012207031;
                            auVar59._24_4_ = auVar160._24_4_ * auVar98._24_4_ * 0.00012207031;
                            auVar59._28_4_ = auVar120._28_4_;
                            auVar120 = vpblendw_avx2(auVar166,auVar161,0xaa);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar60._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar60._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar60._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar60._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar60._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar60._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar60._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar60._28_4_ = auVar120._28_4_;
                            auVar108 = vfmadd231ps_fma(auVar176,auVar99,auVar60);
                            auVar120 = vpsrld_avx2(auVar166,0x10);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar61._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar61._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar61._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar61._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar61._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar61._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar61._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar61._28_4_ = auVar120._28_4_;
                            auVar135 = vfmadd231ps_fma(auVar59,auVar99,auVar61);
                            uVar4 = *(undefined4 *)(pGVar78 + lVar90 * 4 + lVar82);
                            auVar140._4_4_ = uVar4;
                            auVar140._0_4_ = uVar4;
                            auVar140._8_4_ = uVar4;
                            auVar140._12_4_ = uVar4;
                            auVar140._16_4_ = uVar4;
                            auVar140._20_4_ = uVar4;
                            auVar140._24_4_ = uVar4;
                            auVar140._28_4_ = uVar4;
                            auVar120 = vpblendw_avx2(auVar140,auVar161,0xaa);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar62._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar62._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar62._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar62._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar62._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar62._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar62._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar62._28_4_ = auVar120._28_4_;
                            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar156,auVar62);
                            auVar120 = vpsrld_avx2(auVar140,0x10);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar63._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar63._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar63._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar63._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar63._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar63._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar63._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar63._28_4_ = auVar120._28_4_;
                            auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar156,auVar63);
                            local_2bc0 = local_2780._0_8_;
                            uStack_2bb8 = local_2780._8_8_;
                            uStack_2bb0 = local_2780._16_8_;
                            uStack_2ba8 = local_2780._24_8_;
                            local_2ba0 = local_27a0._0_8_;
                            uStack_2b98 = local_27a0._8_8_;
                            uStack_2b90 = local_27a0._16_8_;
                            uStack_2b88 = local_27a0._24_8_;
                            local_2b80 = local_27c0._0_8_;
                            uStack_2b78 = local_27c0._8_8_;
                            uStack_2b70 = local_27c0._16_8_;
                            uStack_2b68 = local_27c0._24_8_;
                            local_2b60 = ZEXT1632(auVar108);
                            local_2b00._4_4_ = uVar6;
                            local_2b00._0_4_ = uVar6;
                            local_2b00._8_4_ = uVar6;
                            local_2b00._12_4_ = uVar6;
                            local_2b00._16_4_ = uVar6;
                            local_2b00._20_4_ = uVar6;
                            local_2b00._24_4_ = uVar6;
                            local_2b00._28_4_ = uVar6;
                            local_2b40 = ZEXT1632(auVar135);
                            auVar108._4_4_ = uVar91;
                            auVar108._0_4_ = uVar91;
                            auVar108._8_4_ = uVar91;
                            auVar108._12_4_ = uVar91;
                            auVar141._16_4_ = uVar91;
                            auVar141._0_16_ = auVar108;
                            auVar141._20_4_ = uVar91;
                            auVar141._24_4_ = uVar91;
                            auVar141._28_4_ = uVar91;
                            vpcmpeqd_avx2(local_2b00,local_2b00);
                            local_2ae0 = context->user->instID[0];
                            local_2ac0 = context->user->instPrimID[0];
                            _local_2ca0 = *(undefined1 (*) [32])(ray + 0x100);
                            auVar120 = vblendvps_avx(_local_2ca0,local_2760,auVar93);
                            *(undefined1 (*) [32])(ray + 0x100) = auVar120;
                            local_2e30.valid = (int *)local_2d40;
                            local_2e30.geometryUserPtr = pGVar7->userPtr;
                            local_2e30.context = context->user;
                            local_2e30.hit = (RTCHitN *)&local_2bc0;
                            local_2e30.N = 8;
                            local_2e30.ray = (RTCRayN *)ray;
                            local_2d80 = auVar205;
                            local_2d40 = auVar93;
                            local_2b20 = auVar141;
                            uStack_2adc = local_2ae0;
                            uStack_2ad8 = local_2ae0;
                            uStack_2ad4 = local_2ae0;
                            uStack_2ad0 = local_2ae0;
                            uStack_2acc = local_2ae0;
                            uStack_2ac8 = local_2ae0;
                            uStack_2ac4 = local_2ae0;
                            uStack_2abc = local_2ac0;
                            uStack_2ab8 = local_2ac0;
                            uStack_2ab4 = local_2ac0;
                            uStack_2ab0 = local_2ac0;
                            uStack_2aac = local_2ac0;
                            uStack_2aa8 = local_2ac0;
                            uStack_2aa4 = local_2ac0;
                            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              local_2d60._0_8_ = lVar87;
                              auVar173 = ZEXT1664(auVar160._0_16_);
                              auVar190 = ZEXT1664(auVar23._0_16_);
                              auVar141 = ZEXT1632(auVar108);
                              (*pGVar7->occlusionFilterN)(&local_2e30);
                              auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                                            CONCAT424(0x7f800000,
                                                                      CONCAT420(0x7f800000,
                                                                                CONCAT416(0x7f800000
                                                                                          ,CONCAT412
                                                  (0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)))))));
                              lVar87 = local_2d60._0_8_;
                            }
                            auVar93 = vpcmpeqd_avx2(local_2d40,_DAT_01faff00);
                            auVar98 = vpcmpeqd_avx2(auVar141,auVar141);
                            auVar120 = auVar98 & ~auVar93;
                            if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar120 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0') &&
                                  (auVar120 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar120[0x1f]) {
                              auVar93 = auVar93 ^ auVar98;
                              auVar198 = ZEXT3264(local_2da0);
                              auVar185 = ZEXT3264(local_2dc0);
                            }
                            else {
                              p_Var8 = context->args->filter;
                              if (p_Var8 == (RTCFilterFunctionN)0x0) {
                                auVar198 = ZEXT3264(local_2da0);
                                auVar185 = ZEXT3264(local_2dc0);
                              }
                              else {
                                auVar198 = ZEXT3264(local_2da0);
                                auVar185 = ZEXT3264(local_2dc0);
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                  auVar173 = ZEXT1664(auVar173._0_16_);
                                  auVar190 = ZEXT1664(auVar190._0_16_);
                                  (*p_Var8)(&local_2e30);
                                  auVar185 = ZEXT3264(local_2dc0);
                                  auVar198 = ZEXT3264(local_2da0);
                                  auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                                                CONCAT424(0x7f800000,
                                                                          CONCAT420(0x7f800000,
                                                                                    CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                }
                              }
                              auVar120 = vpcmpeqd_avx2(local_2d40,_DAT_01faff00);
                              auVar93 = auVar120 ^ _DAT_01fe9960;
                              auVar146._8_4_ = 0xff800000;
                              auVar146._0_8_ = 0xff800000ff800000;
                              auVar146._12_4_ = 0xff800000;
                              auVar146._16_4_ = 0xff800000;
                              auVar146._20_4_ = 0xff800000;
                              auVar146._24_4_ = 0xff800000;
                              auVar146._28_4_ = 0xff800000;
                              auVar120 = vblendvps_avx(auVar146,*(undefined1 (*) [32])
                                                                 (local_2e30.ray + 0x100),auVar120);
                              *(undefined1 (*) [32])(local_2e30.ray + 0x100) = auVar120;
                            }
                            auVar120 = vblendvps_avx(_local_2ca0,*(undefined1 (*) [32])pRVar1,
                                                     auVar93);
                            *(undefined1 (*) [32])pRVar1 = auVar120;
                            auVar205 = local_2d80;
                            auVar20 = local_2dc0;
                            auVar193 = local_2da0;
                          }
                          local_2da0 = auVar193;
                          local_2dc0 = auVar20;
                          auVar93 = vandnps_avx(auVar93,local_2de0);
                          auVar20 = local_2dc0;
                          auVar193 = local_2da0;
                        }
                        local_2da0 = auVar193;
                        local_2dc0 = auVar20;
                        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar93 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar93 >> 0x7f,0) == '\0') &&
                              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar93 >> 0xbf,0) == '\0') &&
                            (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar93[0x1f]) {
                          auVar196 = ZEXT3264(auVar93);
                          break;
                        }
                        auVar120 = *(undefined1 (*) [32])ray;
                        auVar98 = *(undefined1 (*) [32])(ray + 0x20);
                        auVar156 = *(undefined1 (*) [32])(ray + 0x40);
                        local_2d80 = vsubps_avx(local_2640,auVar120);
                        local_2da0 = vsubps_avx(local_2660,auVar98);
                        local_2dc0 = vsubps_avx(local_2680,auVar156);
                        auVar99 = vsubps_avx(local_26a0,auVar120);
                        auVar160 = vsubps_avx(local_26c0,auVar98);
                        auVar161 = vsubps_avx(local_26e0,auVar156);
                        auVar187 = vsubps_avx(auVar205,auVar120);
                        auVar98 = vsubps_avx(auVar198._0_32_,auVar98);
                        auVar156 = vsubps_avx(auVar185._0_32_,auVar156);
                        _local_2ca0 = vsubps_avx(auVar187,local_2d80);
                        local_2c00 = vsubps_avx(auVar98,local_2da0);
                        local_2be0 = vsubps_avx(auVar156,local_2dc0);
                        auVar151._0_4_ = auVar187._0_4_ + local_2d80._0_4_;
                        auVar151._4_4_ = auVar187._4_4_ + local_2d80._4_4_;
                        auVar151._8_4_ = auVar187._8_4_ + local_2d80._8_4_;
                        auVar151._12_4_ = auVar187._12_4_ + local_2d80._12_4_;
                        auVar151._16_4_ = auVar187._16_4_ + local_2d80._16_4_;
                        auVar151._20_4_ = auVar187._20_4_ + local_2d80._20_4_;
                        auVar151._24_4_ = auVar187._24_4_ + local_2d80._24_4_;
                        auVar151._28_4_ = auVar187._28_4_ + local_2d80._28_4_;
                        auVar169._0_4_ = local_2da0._0_4_ + auVar98._0_4_;
                        auVar169._4_4_ = local_2da0._4_4_ + auVar98._4_4_;
                        auVar169._8_4_ = local_2da0._8_4_ + auVar98._8_4_;
                        auVar169._12_4_ = local_2da0._12_4_ + auVar98._12_4_;
                        auVar169._16_4_ = local_2da0._16_4_ + auVar98._16_4_;
                        auVar169._20_4_ = local_2da0._20_4_ + auVar98._20_4_;
                        auVar169._24_4_ = local_2da0._24_4_ + auVar98._24_4_;
                        auVar169._28_4_ = local_2da0._28_4_ + auVar98._28_4_;
                        fVar9 = local_2dc0._0_4_;
                        auVar183._0_4_ = auVar156._0_4_ + fVar9;
                        fVar10 = local_2dc0._4_4_;
                        auVar183._4_4_ = auVar156._4_4_ + fVar10;
                        fVar11 = local_2dc0._8_4_;
                        auVar183._8_4_ = auVar156._8_4_ + fVar11;
                        fVar12 = local_2dc0._12_4_;
                        auVar183._12_4_ = auVar156._12_4_ + fVar12;
                        fVar13 = local_2dc0._16_4_;
                        auVar183._16_4_ = auVar156._16_4_ + fVar13;
                        fVar14 = local_2dc0._20_4_;
                        auVar183._20_4_ = auVar156._20_4_ + fVar14;
                        fVar15 = local_2dc0._24_4_;
                        auVar183._24_4_ = auVar156._24_4_ + fVar15;
                        fVar106 = local_2dc0._28_4_;
                        fVar159 = auVar156._28_4_;
                        auVar183._28_4_ = fVar159 + fVar106;
                        auVar196._0_4_ = local_2be0._0_4_ * auVar169._0_4_;
                        auVar196._4_4_ = local_2be0._4_4_ * auVar169._4_4_;
                        auVar196._8_4_ = local_2be0._8_4_ * auVar169._8_4_;
                        auVar196._12_4_ = local_2be0._12_4_ * auVar169._12_4_;
                        auVar196._16_4_ = local_2be0._16_4_ * auVar169._16_4_;
                        auVar196._20_4_ = local_2be0._20_4_ * auVar169._20_4_;
                        auVar196._28_36_ = auVar194._28_36_;
                        auVar196._24_4_ = local_2be0._24_4_ * auVar169._24_4_;
                        auVar135 = vfmsub231ps_fma(auVar196._0_32_,local_2c00,auVar183);
                        auVar185._0_4_ = auVar183._0_4_ * local_2ca0._0_4_;
                        auVar185._4_4_ = auVar183._4_4_ * local_2ca0._4_4_;
                        auVar185._8_4_ = auVar183._8_4_ * local_2ca0._8_4_;
                        auVar185._12_4_ = auVar183._12_4_ * local_2ca0._12_4_;
                        auVar185._16_4_ = auVar183._16_4_ * local_2ca0._16_4_;
                        auVar185._20_4_ = auVar183._20_4_ * local_2ca0._20_4_;
                        auVar185._28_36_ = auVar190._28_36_;
                        auVar185._24_4_ = auVar183._24_4_ * local_2ca0._24_4_;
                        auVar108 = vfmsub231ps_fma(auVar185._0_32_,local_2be0,auVar151);
                        auVar41._4_4_ = auVar151._4_4_ * local_2c00._4_4_;
                        auVar41._0_4_ = auVar151._0_4_ * local_2c00._0_4_;
                        auVar41._8_4_ = auVar151._8_4_ * local_2c00._8_4_;
                        auVar41._12_4_ = auVar151._12_4_ * local_2c00._12_4_;
                        auVar41._16_4_ = auVar151._16_4_ * local_2c00._16_4_;
                        auVar41._20_4_ = auVar151._20_4_ * local_2c00._20_4_;
                        auVar41._24_4_ = auVar151._24_4_ * local_2c00._24_4_;
                        auVar41._28_4_ = auVar151._28_4_;
                        auVar179 = vfmsub231ps_fma(auVar41,_local_2ca0,auVar169);
                        fVar107 = *(float *)(ray + 0xc0);
                        fVar124 = *(float *)(ray + 0xc4);
                        fVar126 = *(float *)(ray + 200);
                        fVar128 = *(float *)(ray + 0xcc);
                        fVar130 = *(float *)(ray + 0xd0);
                        fVar132 = *(float *)(ray + 0xd4);
                        fVar134 = *(float *)(ray + 0xd8);
                        auVar72 = *(undefined1 (*) [28])(ray + 0xc0);
                        auVar152._0_4_ = fVar107 * auVar179._0_4_;
                        auVar152._4_4_ = fVar124 * auVar179._4_4_;
                        auVar152._8_4_ = fVar126 * auVar179._8_4_;
                        auVar152._12_4_ = fVar128 * auVar179._12_4_;
                        auVar152._16_4_ = fVar130 * 0.0;
                        auVar152._20_4_ = fVar132 * 0.0;
                        auVar152._24_4_ = fVar134 * 0.0;
                        auVar152._28_4_ = 0;
                        local_2d60 = *(undefined1 (*) [32])(ray + 0xa0);
                        auVar108 = vfmadd231ps_fma(auVar152,local_2d60,ZEXT1632(auVar108));
                        auVar120 = *(undefined1 (*) [32])(ray + 0x80);
                        auVar190 = ZEXT3264(auVar120);
                        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar120,ZEXT1632(auVar135));
                        local_2c20 = vsubps_avx(local_2da0,auVar160);
                        auVar119 = vsubps_avx(local_2dc0,auVar161);
                        auVar170._0_4_ = local_2da0._0_4_ + auVar160._0_4_;
                        auVar170._4_4_ = local_2da0._4_4_ + auVar160._4_4_;
                        auVar170._8_4_ = local_2da0._8_4_ + auVar160._8_4_;
                        auVar170._12_4_ = local_2da0._12_4_ + auVar160._12_4_;
                        auVar170._16_4_ = local_2da0._16_4_ + auVar160._16_4_;
                        auVar170._20_4_ = local_2da0._20_4_ + auVar160._20_4_;
                        auVar170._24_4_ = local_2da0._24_4_ + auVar160._24_4_;
                        auVar170._28_4_ = local_2da0._28_4_ + auVar160._28_4_;
                        auVar206._0_4_ = fVar9 + auVar161._0_4_;
                        auVar206._4_4_ = fVar10 + auVar161._4_4_;
                        auVar206._8_4_ = fVar11 + auVar161._8_4_;
                        auVar206._12_4_ = fVar12 + auVar161._12_4_;
                        auVar206._16_4_ = fVar13 + auVar161._16_4_;
                        auVar206._20_4_ = fVar14 + auVar161._20_4_;
                        auVar206._24_4_ = fVar15 + auVar161._24_4_;
                        auVar206._28_4_ = fVar106 + auVar161._28_4_;
                        fVar192 = auVar119._0_4_;
                        fVar197 = auVar119._4_4_;
                        auVar42._4_4_ = fVar197 * auVar170._4_4_;
                        auVar42._0_4_ = fVar192 * auVar170._0_4_;
                        fVar199 = auVar119._8_4_;
                        auVar42._8_4_ = fVar199 * auVar170._8_4_;
                        fVar200 = auVar119._12_4_;
                        auVar42._12_4_ = fVar200 * auVar170._12_4_;
                        fVar201 = auVar119._16_4_;
                        auVar42._16_4_ = fVar201 * auVar170._16_4_;
                        fVar202 = auVar119._20_4_;
                        auVar42._20_4_ = fVar202 * auVar170._20_4_;
                        fVar203 = auVar119._24_4_;
                        auVar42._24_4_ = fVar203 * auVar170._24_4_;
                        auVar42._28_4_ = fVar106;
                        auVar179 = vfmsub231ps_fma(auVar42,local_2c20,auVar206);
                        auVar193 = vsubps_avx(local_2d80,auVar99);
                        auVar198 = ZEXT3264(auVar193);
                        fVar106 = auVar193._0_4_;
                        fVar104 = auVar193._4_4_;
                        auVar43._4_4_ = auVar206._4_4_ * fVar104;
                        auVar43._0_4_ = auVar206._0_4_ * fVar106;
                        fVar16 = auVar193._8_4_;
                        auVar43._8_4_ = auVar206._8_4_ * fVar16;
                        fVar18 = auVar193._12_4_;
                        auVar43._12_4_ = auVar206._12_4_ * fVar18;
                        fVar123 = auVar193._16_4_;
                        auVar43._16_4_ = auVar206._16_4_ * fVar123;
                        fVar127 = auVar193._20_4_;
                        auVar43._20_4_ = auVar206._20_4_ * fVar127;
                        fVar131 = auVar193._24_4_;
                        auVar43._24_4_ = auVar206._24_4_ * fVar131;
                        auVar43._28_4_ = auVar206._28_4_;
                        auVar175._0_4_ = auVar99._0_4_ + local_2d80._0_4_;
                        auVar175._4_4_ = auVar99._4_4_ + local_2d80._4_4_;
                        auVar175._8_4_ = auVar99._8_4_ + local_2d80._8_4_;
                        auVar175._12_4_ = auVar99._12_4_ + local_2d80._12_4_;
                        auVar175._16_4_ = auVar99._16_4_ + local_2d80._16_4_;
                        auVar175._20_4_ = auVar99._20_4_ + local_2d80._20_4_;
                        auVar175._24_4_ = auVar99._24_4_ + local_2d80._24_4_;
                        auVar175._28_4_ = auVar99._28_4_ + local_2d80._28_4_;
                        auVar135 = vfmsub231ps_fma(auVar43,auVar119,auVar175);
                        fVar103 = local_2c20._0_4_;
                        fVar105 = local_2c20._4_4_;
                        auVar44._4_4_ = auVar175._4_4_ * fVar105;
                        auVar44._0_4_ = auVar175._0_4_ * fVar103;
                        fVar17 = local_2c20._8_4_;
                        auVar44._8_4_ = auVar175._8_4_ * fVar17;
                        fVar19 = local_2c20._12_4_;
                        auVar44._12_4_ = auVar175._12_4_ * fVar19;
                        fVar125 = local_2c20._16_4_;
                        auVar44._16_4_ = auVar175._16_4_ * fVar125;
                        fVar129 = local_2c20._20_4_;
                        auVar44._20_4_ = auVar175._20_4_ * fVar129;
                        fVar133 = local_2c20._24_4_;
                        auVar44._24_4_ = auVar175._24_4_ * fVar133;
                        auVar44._28_4_ = auVar175._28_4_;
                        auVar21 = vfmsub231ps_fma(auVar44,auVar193,auVar170);
                        auVar45._4_4_ = fVar124 * auVar21._4_4_;
                        auVar45._0_4_ = fVar107 * auVar21._0_4_;
                        auVar45._8_4_ = fVar126 * auVar21._8_4_;
                        auVar45._12_4_ = fVar128 * auVar21._12_4_;
                        auVar45._16_4_ = fVar130 * 0.0;
                        auVar45._20_4_ = fVar132 * 0.0;
                        auVar45._24_4_ = fVar134 * 0.0;
                        auVar45._28_4_ = auVar170._28_4_;
                        auVar135 = vfmadd231ps_fma(auVar45,local_2d60,ZEXT1632(auVar135));
                        auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar120,ZEXT1632(auVar179));
                        auVar173 = ZEXT1664(auVar135);
                        auVar97 = vsubps_avx(auVar99,auVar187);
                        auVar118._0_4_ = auVar99._0_4_ + auVar187._0_4_;
                        auVar118._4_4_ = auVar99._4_4_ + auVar187._4_4_;
                        auVar118._8_4_ = auVar99._8_4_ + auVar187._8_4_;
                        auVar118._12_4_ = auVar99._12_4_ + auVar187._12_4_;
                        auVar118._16_4_ = auVar99._16_4_ + auVar187._16_4_;
                        auVar118._20_4_ = auVar99._20_4_ + auVar187._20_4_;
                        auVar118._24_4_ = auVar99._24_4_ + auVar187._24_4_;
                        auVar118._28_4_ = auVar99._28_4_ + auVar187._28_4_;
                        auVar187 = vsubps_avx(auVar160,auVar98);
                        auVar100._0_4_ = auVar160._0_4_ + auVar98._0_4_;
                        auVar100._4_4_ = auVar160._4_4_ + auVar98._4_4_;
                        auVar100._8_4_ = auVar160._8_4_ + auVar98._8_4_;
                        auVar100._12_4_ = auVar160._12_4_ + auVar98._12_4_;
                        auVar100._16_4_ = auVar160._16_4_ + auVar98._16_4_;
                        auVar100._20_4_ = auVar160._20_4_ + auVar98._20_4_;
                        auVar100._24_4_ = auVar160._24_4_ + auVar98._24_4_;
                        auVar100._28_4_ = auVar160._28_4_ + auVar98._28_4_;
                        auVar20 = vsubps_avx(auVar161,auVar156);
                        auVar138._0_4_ = auVar161._0_4_ + auVar156._0_4_;
                        auVar138._4_4_ = auVar161._4_4_ + auVar156._4_4_;
                        auVar138._8_4_ = auVar161._8_4_ + auVar156._8_4_;
                        auVar138._12_4_ = auVar161._12_4_ + auVar156._12_4_;
                        auVar138._16_4_ = auVar161._16_4_ + auVar156._16_4_;
                        auVar138._20_4_ = auVar161._20_4_ + auVar156._20_4_;
                        auVar138._24_4_ = auVar161._24_4_ + auVar156._24_4_;
                        auVar138._28_4_ = auVar161._28_4_ + fVar159;
                        auVar46._4_4_ = auVar20._4_4_ * auVar100._4_4_;
                        auVar46._0_4_ = auVar20._0_4_ * auVar100._0_4_;
                        auVar46._8_4_ = auVar20._8_4_ * auVar100._8_4_;
                        auVar46._12_4_ = auVar20._12_4_ * auVar100._12_4_;
                        auVar46._16_4_ = auVar20._16_4_ * auVar100._16_4_;
                        auVar46._20_4_ = auVar20._20_4_ * auVar100._20_4_;
                        auVar46._24_4_ = auVar20._24_4_ * auVar100._24_4_;
                        auVar46._28_4_ = fVar159;
                        auVar21 = vfmsub231ps_fma(auVar46,auVar187,auVar138);
                        auVar47._4_4_ = auVar97._4_4_ * auVar138._4_4_;
                        auVar47._0_4_ = auVar97._0_4_ * auVar138._0_4_;
                        auVar47._8_4_ = auVar97._8_4_ * auVar138._8_4_;
                        auVar47._12_4_ = auVar97._12_4_ * auVar138._12_4_;
                        auVar47._16_4_ = auVar97._16_4_ * auVar138._16_4_;
                        auVar47._20_4_ = auVar97._20_4_ * auVar138._20_4_;
                        auVar47._24_4_ = auVar97._24_4_ * auVar138._24_4_;
                        auVar47._28_4_ = auVar138._28_4_;
                        auVar179 = vfmsub231ps_fma(auVar47,auVar20,auVar118);
                        auVar48._4_4_ = auVar187._4_4_ * auVar118._4_4_;
                        auVar48._0_4_ = auVar187._0_4_ * auVar118._0_4_;
                        auVar48._8_4_ = auVar187._8_4_ * auVar118._8_4_;
                        auVar48._12_4_ = auVar187._12_4_ * auVar118._12_4_;
                        auVar48._16_4_ = auVar187._16_4_ * auVar118._16_4_;
                        auVar48._20_4_ = auVar187._20_4_ * auVar118._20_4_;
                        auVar48._24_4_ = auVar187._24_4_ * auVar118._24_4_;
                        auVar48._28_4_ = auVar118._28_4_;
                        auVar22 = vfmsub231ps_fma(auVar48,auVar97,auVar100);
                        auVar49._4_4_ = fVar124 * auVar22._4_4_;
                        auVar49._0_4_ = fVar107 * auVar22._0_4_;
                        auVar49._8_4_ = fVar126 * auVar22._8_4_;
                        auVar49._12_4_ = fVar128 * auVar22._12_4_;
                        auVar49._16_4_ = fVar130 * 0.0;
                        auVar49._20_4_ = fVar132 * 0.0;
                        auVar49._24_4_ = fVar134 * 0.0;
                        auVar49._28_4_ = auVar100._28_4_;
                        auVar185 = ZEXT3264(local_2d60);
                        auVar179 = vfmadd231ps_fma(auVar49,local_2d60,ZEXT1632(auVar179));
                        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar120,ZEXT1632(auVar21));
                        auVar164 = ZEXT1632(CONCAT412(auVar179._12_4_ +
                                                      auVar108._12_4_ + auVar135._12_4_,
                                                      CONCAT48(auVar179._8_4_ +
                                                               auVar108._8_4_ + auVar135._8_4_,
                                                               CONCAT44(auVar179._4_4_ +
                                                                        auVar108._4_4_ +
                                                                        auVar135._4_4_,
                                                                        auVar179._0_4_ +
                                                                        auVar108._0_4_ +
                                                                        auVar135._0_4_))));
                        auVar178 = ZEXT436(local_2c80._28_4_);
                        auVar98 = vandps_avx(auVar164,local_2c80);
                        fVar107 = auVar98._0_4_ * 1.1920929e-07;
                        fVar124 = auVar98._4_4_ * 1.1920929e-07;
                        auVar50._4_4_ = fVar124;
                        auVar50._0_4_ = fVar107;
                        fVar126 = auVar98._8_4_ * 1.1920929e-07;
                        auVar50._8_4_ = fVar126;
                        fVar128 = auVar98._12_4_ * 1.1920929e-07;
                        auVar50._12_4_ = fVar128;
                        fVar130 = auVar98._16_4_ * 1.1920929e-07;
                        auVar50._16_4_ = fVar130;
                        fVar132 = auVar98._20_4_ * 1.1920929e-07;
                        auVar50._20_4_ = fVar132;
                        fVar134 = auVar98._24_4_ * 1.1920929e-07;
                        auVar50._24_4_ = fVar134;
                        auVar50._28_4_ = auVar98._28_4_;
                        auVar153 = ZEXT1632(auVar108);
                        auVar156 = vminps_avx(auVar153,ZEXT1632(auVar135));
                        auVar156 = vminps_avx(auVar156,ZEXT1632(auVar179));
                        auVar158._0_4_ = (uint)fVar107 ^ local_2e00._0_4_;
                        auVar158._4_4_ = (uint)fVar124 ^ local_2e00._4_4_;
                        auVar158._8_4_ = (uint)fVar126 ^ local_2e00._8_4_;
                        auVar158._12_4_ = (uint)fVar128 ^ local_2e00._12_4_;
                        auVar158._16_4_ = (uint)fVar130 ^ local_2e00._16_4_;
                        auVar158._20_4_ = (uint)fVar132 ^ local_2e00._20_4_;
                        auVar158._24_4_ = (uint)fVar134 ^ local_2e00._24_4_;
                        auVar158._28_4_ = auVar98._28_4_ ^ local_2e00._28_4_;
                        auVar156 = vcmpps_avx(auVar156,auVar158,5);
                        auVar99 = vmaxps_avx(auVar153,ZEXT1632(auVar135));
                        auVar98 = vmaxps_avx(auVar99,ZEXT1632(auVar179));
                        auVar98 = vcmpps_avx(auVar98,auVar50,2);
                        auVar160 = vorps_avx(auVar156,auVar98);
                        auVar161 = auVar93 & auVar160;
                        auVar98 = vandps_avx(auVar160,auVar93);
                        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar161 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar161 >> 0x7f,0) != '\0')
                              || (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar161 >> 0xbf,0) != '\0') ||
                            (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar161[0x1f] < '\0') {
                          auVar51._4_4_ = fVar105 * local_2be0._4_4_;
                          auVar51._0_4_ = fVar103 * local_2be0._0_4_;
                          auVar51._8_4_ = fVar17 * local_2be0._8_4_;
                          auVar51._12_4_ = fVar19 * local_2be0._12_4_;
                          auVar51._16_4_ = fVar125 * local_2be0._16_4_;
                          auVar51._20_4_ = fVar129 * local_2be0._20_4_;
                          auVar51._24_4_ = fVar133 * local_2be0._24_4_;
                          auVar51._28_4_ = auVar160._28_4_;
                          local_2c40._4_4_ = fVar104 * local_2c00._4_4_;
                          local_2c40._0_4_ = fVar106 * local_2c00._0_4_;
                          uStack_2c38._0_4_ = fVar16 * local_2c00._8_4_;
                          uStack_2c38._4_4_ = fVar18 * local_2c00._12_4_;
                          fStack_2c30 = fVar123 * local_2c00._16_4_;
                          fStack_2c2c = fVar127 * local_2c00._20_4_;
                          fStack_2c28 = fVar131 * local_2c00._24_4_;
                          uStack_2c24 = auVar156._28_4_;
                          auVar108 = vfmsub213ps_fma(local_2c00,auVar119,auVar51);
                          auVar52._4_4_ = auVar187._4_4_ * fVar197;
                          auVar52._0_4_ = auVar187._0_4_ * fVar192;
                          auVar52._8_4_ = auVar187._8_4_ * fVar199;
                          auVar52._12_4_ = auVar187._12_4_ * fVar200;
                          auVar52._16_4_ = auVar187._16_4_ * fVar201;
                          auVar52._20_4_ = auVar187._20_4_ * fVar202;
                          auVar52._24_4_ = auVar187._24_4_ * fVar203;
                          auVar52._28_4_ = auVar156._28_4_;
                          auVar53._4_4_ = fVar104 * auVar20._4_4_;
                          auVar53._0_4_ = fVar106 * auVar20._0_4_;
                          auVar53._8_4_ = fVar16 * auVar20._8_4_;
                          auVar53._12_4_ = fVar18 * auVar20._12_4_;
                          auVar53._16_4_ = fVar123 * auVar20._16_4_;
                          auVar53._20_4_ = fVar127 * auVar20._20_4_;
                          auVar53._24_4_ = fVar131 * auVar20._24_4_;
                          auVar53._28_4_ = auVar99._28_4_;
                          auVar179 = vfmsub213ps_fma(auVar20,local_2c20,auVar52);
                          auVar156 = vandps_avx(auVar51,local_2c80);
                          auVar99 = vandps_avx(auVar52,local_2c80);
                          auVar156 = vcmpps_avx(auVar156,auVar99,1);
                          auVar160 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar108),auVar156);
                          auVar165._0_4_ = auVar97._0_4_ * fVar103;
                          auVar165._4_4_ = auVar97._4_4_ * fVar105;
                          auVar165._8_4_ = auVar97._8_4_ * fVar17;
                          auVar165._12_4_ = auVar97._12_4_ * fVar19;
                          auVar165._16_4_ = auVar97._16_4_ * fVar125;
                          auVar165._20_4_ = auVar97._20_4_ * fVar129;
                          auVar165._24_4_ = auVar97._24_4_ * fVar133;
                          auVar165._28_4_ = 0;
                          auVar108 = vfmsub213ps_fma(auVar97,auVar119,auVar53);
                          auVar54._4_4_ = local_2ca0._4_4_ * fVar197;
                          auVar54._0_4_ = local_2ca0._0_4_ * fVar192;
                          auVar54._8_4_ = local_2ca0._8_4_ * fVar199;
                          auVar54._12_4_ = local_2ca0._12_4_ * fVar200;
                          auVar54._16_4_ = local_2ca0._16_4_ * fVar201;
                          auVar54._20_4_ = local_2ca0._20_4_ * fVar202;
                          auVar54._24_4_ = local_2ca0._24_4_ * fVar203;
                          auVar54._28_4_ = auVar99._28_4_;
                          auVar179 = vfmsub213ps_fma(local_2be0,auVar193,auVar54);
                          auVar156 = vandps_avx(auVar54,local_2c80);
                          auVar99 = vandps_avx(auVar53,local_2c80);
                          auVar156 = vcmpps_avx(auVar156,auVar99,1);
                          auVar161 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar179),auVar156);
                          auVar108 = vfmsub213ps_fma(_local_2ca0,local_2c20,_local_2c40);
                          auVar179 = vfmsub213ps_fma(auVar187,auVar193,auVar165);
                          auVar156 = vandps_avx(_local_2c40,local_2c80);
                          auVar99 = vandps_avx(auVar165,local_2c80);
                          auVar99 = vcmpps_avx(auVar156,auVar99,1);
                          auVar156 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar108),auVar99);
                          local_2ea0 = auVar72._0_4_;
                          fStack_2e9c = auVar72._4_4_;
                          fStack_2e98 = auVar72._8_4_;
                          fStack_2e94 = auVar72._12_4_;
                          fStack_2e90 = auVar72._16_4_;
                          fStack_2e8c = auVar72._20_4_;
                          fStack_2e88 = auVar72._24_4_;
                          auVar55._4_4_ = auVar156._4_4_ * fStack_2e9c;
                          auVar55._0_4_ = auVar156._0_4_ * local_2ea0;
                          auVar55._8_4_ = auVar156._8_4_ * fStack_2e98;
                          auVar55._12_4_ = auVar156._12_4_ * fStack_2e94;
                          auVar55._16_4_ = auVar156._16_4_ * fStack_2e90;
                          auVar55._20_4_ = auVar156._20_4_ * fStack_2e8c;
                          auVar55._24_4_ = auVar156._24_4_ * fStack_2e88;
                          auVar55._28_4_ = auVar99._28_4_;
                          auVar108 = vfmadd213ps_fma(local_2d60,auVar161,auVar55);
                          auVar108 = vfmadd213ps_fma(auVar120,auVar160,ZEXT1632(auVar108));
                          auVar190 = ZEXT1664(auVar108);
                          fVar106 = auVar108._0_4_ + auVar108._0_4_;
                          fVar103 = auVar108._4_4_ + auVar108._4_4_;
                          fVar104 = auVar108._8_4_ + auVar108._8_4_;
                          fVar105 = auVar108._12_4_ + auVar108._12_4_;
                          auVar119 = ZEXT1632(CONCAT412(fVar105,CONCAT48(fVar104,CONCAT44(fVar103,
                                                  fVar106))));
                          auVar56._4_4_ = auVar156._4_4_ * fVar10;
                          auVar56._0_4_ = auVar156._0_4_ * fVar9;
                          auVar56._8_4_ = auVar156._8_4_ * fVar11;
                          auVar56._12_4_ = auVar156._12_4_ * fVar12;
                          auVar56._16_4_ = auVar156._16_4_ * fVar13;
                          auVar56._20_4_ = auVar156._20_4_ * fVar14;
                          auVar56._24_4_ = auVar156._24_4_ * fVar15;
                          auVar56._28_4_ = 0;
                          auVar108 = vfmadd213ps_fma(local_2da0,auVar161,auVar56);
                          auVar179 = vfmadd213ps_fma(local_2d80,auVar160,ZEXT1632(auVar108));
                          auVar120 = vrcpps_avx(auVar119);
                          auVar189._8_4_ = 0x3f800000;
                          auVar189._0_8_ = 0x3f8000003f800000;
                          auVar189._12_4_ = 0x3f800000;
                          auVar189._16_4_ = 0x3f800000;
                          auVar189._20_4_ = 0x3f800000;
                          auVar189._24_4_ = 0x3f800000;
                          auVar189._28_4_ = 0x3f800000;
                          auVar108 = vfnmadd213ps_fma(auVar120,auVar119,auVar189);
                          auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar120,auVar120);
                          auVar187 = ZEXT1632(CONCAT412(auVar108._12_4_ *
                                                        (auVar179._12_4_ + auVar179._12_4_),
                                                        CONCAT48(auVar108._8_4_ *
                                                                 (auVar179._8_4_ + auVar179._8_4_),
                                                                 CONCAT44(auVar108._4_4_ *
                                                                          (auVar179._4_4_ +
                                                                          auVar179._4_4_),
                                                                          auVar108._0_4_ *
                                                                          (auVar179._0_4_ +
                                                                          auVar179._0_4_)))));
                          auVar120 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar187,2);
                          auVar99 = vcmpps_avx(auVar187,*(undefined1 (*) [32])(ray + 0x100),2);
                          auVar120 = vandps_avx(auVar99,auVar120);
                          auVar184._0_4_ = (uint)fVar106 ^ local_2e00._0_4_;
                          auVar184._4_4_ = (uint)fVar103 ^ local_2e00._4_4_;
                          auVar184._8_4_ = (uint)fVar104 ^ local_2e00._8_4_;
                          auVar184._12_4_ = (uint)fVar105 ^ local_2e00._12_4_;
                          auVar184._16_4_ = local_2e00._16_4_;
                          auVar184._20_4_ = local_2e00._20_4_;
                          auVar184._24_4_ = local_2e00._24_4_;
                          auVar184._28_4_ = local_2e00._28_4_;
                          auVar185 = ZEXT3264(auVar184);
                          auVar99 = vcmpps_avx(auVar184,auVar119,4);
                          auVar120 = vandps_avx(auVar99,auVar120);
                          auVar120 = vpslld_avx2(auVar120,0x1f);
                          auVar99 = vpsrad_avx2(auVar120,0x1f);
                          auVar178 = ZEXT436(auVar98._28_4_);
                          auVar120 = auVar98 & auVar99;
                          auVar98 = vandps_avx(auVar99,auVar98);
                          local_2c60 = auVar164;
                          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar120 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar120 >> 0x7f,0) != '\0') ||
                                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar120 >> 0xbf,0) != '\0') ||
                              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar120[0x1f] < '\0') {
                            local_28a0 = auVar156;
                            local_2880 = auVar161;
                            local_2860 = auVar160;
                            local_2840 = auVar187;
                            local_2820 = auVar164;
                            _local_2800 = ZEXT1632(auVar135);
                            _local_27e0 = auVar153;
                          }
                        }
                        auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        uVar6 = *(uint *)(local_2e40.super_Precalculations.grid + 0x18);
                        pGVar7 = (context->scene->geometries).items[uVar6].ptr;
                        uVar3 = pGVar7->mask;
                        auVar101._4_4_ = uVar3;
                        auVar101._0_4_ = uVar3;
                        auVar101._8_4_ = uVar3;
                        auVar101._12_4_ = uVar3;
                        auVar101._16_4_ = uVar3;
                        auVar101._20_4_ = uVar3;
                        auVar101._24_4_ = uVar3;
                        auVar101._28_4_ = uVar3;
                        auVar120 = vpand_avx2(auVar101,*(undefined1 (*) [32])(ray + 0x120));
                        auVar156 = vpcmpeqd_avx2(auVar120,_DAT_01faff00);
                        auVar120 = auVar98 & ~auVar156;
                        local_2de0 = auVar93;
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0')
                              && (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar120[0x1f]) {
                          auVar196 = ZEXT3264(auVar93);
                        }
                        else {
                          uVar91 = *(undefined4 *)(local_2e40.super_Precalculations.grid + 0x1c);
                          auVar93 = vandnps_avx(auVar156,auVar98);
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar120 = vandps_avx(local_2820,local_2c80);
                            auVar98 = vrcpps_avx(local_2820);
                            auVar172._8_4_ = 0x3f800000;
                            auVar172._0_8_ = 0x3f8000003f800000;
                            auVar172._12_4_ = 0x3f800000;
                            auVar172._16_4_ = 0x3f800000;
                            auVar172._20_4_ = 0x3f800000;
                            auVar172._24_4_ = 0x3f800000;
                            auVar172._28_4_ = 0x3f800000;
                            auVar108 = vfnmadd213ps_fma(auVar98,local_2820,auVar172);
                            auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar98,auVar98);
                            auVar142._8_4_ = 0x219392ef;
                            auVar142._0_8_ = 0x219392ef219392ef;
                            auVar142._12_4_ = 0x219392ef;
                            auVar142._16_4_ = 0x219392ef;
                            auVar142._20_4_ = 0x219392ef;
                            auVar142._24_4_ = 0x219392ef;
                            auVar142._28_4_ = 0x219392ef;
                            auVar98 = vcmpps_avx(auVar120,auVar142,5);
                            auVar120 = vandps_avx(auVar98,ZEXT1632(auVar108));
                            auVar64._4_4_ = auVar120._4_4_ * (float)local_27e0._4_4_;
                            auVar64._0_4_ = auVar120._0_4_ * (float)local_27e0._0_4_;
                            auVar64._8_4_ = auVar120._8_4_ * fStack_27d8;
                            auVar64._12_4_ = auVar120._12_4_ * fStack_27d4;
                            auVar64._16_4_ = auVar120._16_4_ * fStack_27d0;
                            auVar64._20_4_ = auVar120._20_4_ * fStack_27cc;
                            auVar64._24_4_ = auVar120._24_4_ * fStack_27c8;
                            auVar64._28_4_ = auVar98._28_4_;
                            auVar156 = vminps_avx(auVar64,auVar172);
                            auVar65._4_4_ = auVar120._4_4_ * (float)local_2800._4_4_;
                            auVar65._0_4_ = auVar120._0_4_ * (float)local_2800._0_4_;
                            auVar65._8_4_ = auVar120._8_4_ * fStack_27f8;
                            auVar65._12_4_ = auVar120._12_4_ * fStack_27f4;
                            auVar65._16_4_ = auVar120._16_4_ * fStack_27f0;
                            auVar65._20_4_ = auVar120._20_4_ * fStack_27ec;
                            auVar65._24_4_ = auVar120._24_4_ * fStack_27e8;
                            auVar65._28_4_ = auVar120._28_4_;
                            auVar99 = vminps_avx(auVar65,auVar172);
                            uVar4 = *(undefined4 *)(pGVar75 + lVar90 * 4 + lVar92);
                            auVar155._4_4_ = uVar4;
                            auVar155._0_4_ = uVar4;
                            auVar155._8_4_ = uVar4;
                            auVar155._12_4_ = uVar4;
                            auVar155._16_4_ = uVar4;
                            auVar155._20_4_ = uVar4;
                            auVar155._24_4_ = uVar4;
                            auVar155._28_4_ = uVar4;
                            auVar98 = vpsrld_avx2(auVar155,0x10);
                            auVar179 = ZEXT816(0) << 0x40;
                            auVar185 = ZEXT1664(auVar179);
                            auVar120 = vpblendw_avx2(auVar155,ZEXT1632(auVar179),0xaa);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar98 = vcvtdq2ps_avx(auVar98);
                            uVar4 = *(undefined4 *)(pGVar75 + lVar90 * 4 + lVar92 + 4);
                            auVar167._4_4_ = uVar4;
                            auVar167._0_4_ = uVar4;
                            auVar167._8_4_ = uVar4;
                            auVar167._12_4_ = uVar4;
                            auVar167._16_4_ = uVar4;
                            auVar167._20_4_ = uVar4;
                            auVar167._24_4_ = uVar4;
                            auVar167._28_4_ = uVar4;
                            auVar160 = vsubps_avx(auVar172,auVar156);
                            auVar160 = vsubps_avx(auVar160,auVar99);
                            auVar173 = ZEXT3264(auVar160);
                            auVar177._0_4_ = auVar160._0_4_ * auVar120._0_4_ * 0.00012207031;
                            auVar177._4_4_ = auVar160._4_4_ * auVar120._4_4_ * 0.00012207031;
                            auVar177._8_4_ = auVar160._8_4_ * auVar120._8_4_ * 0.00012207031;
                            auVar177._12_4_ = auVar160._12_4_ * auVar120._12_4_ * 0.00012207031;
                            auVar177._16_4_ = auVar160._16_4_ * auVar120._16_4_ * 0.00012207031;
                            auVar177._20_4_ = auVar160._20_4_ * auVar120._20_4_ * 0.00012207031;
                            auVar177._24_4_ = auVar160._24_4_ * auVar120._24_4_ * 0.00012207031;
                            auVar177._28_36_ = auVar178;
                            auVar66._4_4_ = auVar160._4_4_ * auVar98._4_4_ * 0.00012207031;
                            auVar66._0_4_ = auVar160._0_4_ * auVar98._0_4_ * 0.00012207031;
                            auVar66._8_4_ = auVar160._8_4_ * auVar98._8_4_ * 0.00012207031;
                            auVar66._12_4_ = auVar160._12_4_ * auVar98._12_4_ * 0.00012207031;
                            auVar66._16_4_ = auVar160._16_4_ * auVar98._16_4_ * 0.00012207031;
                            auVar66._20_4_ = auVar160._20_4_ * auVar98._20_4_ * 0.00012207031;
                            auVar66._24_4_ = auVar160._24_4_ * auVar98._24_4_ * 0.00012207031;
                            auVar66._28_4_ = auVar120._28_4_;
                            auVar120 = vpblendw_avx2(auVar167,ZEXT1632(auVar179),0xaa);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar67._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar67._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar67._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar67._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar67._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar67._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar67._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar67._28_4_ = auVar120._28_4_;
                            auVar108 = vfmadd231ps_fma(auVar177._0_32_,auVar99,auVar67);
                            auVar120 = vpsrld_avx2(auVar167,0x10);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar68._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar68._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar68._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar68._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar68._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar68._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar68._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar68._28_4_ = auVar120._28_4_;
                            auVar135 = vfmadd231ps_fma(auVar66,auVar99,auVar68);
                            uVar4 = *(undefined4 *)(pGVar78 + lVar90 * 4 + lVar82);
                            auVar143._4_4_ = uVar4;
                            auVar143._0_4_ = uVar4;
                            auVar143._8_4_ = uVar4;
                            auVar143._12_4_ = uVar4;
                            auVar143._16_4_ = uVar4;
                            auVar143._20_4_ = uVar4;
                            auVar143._24_4_ = uVar4;
                            auVar143._28_4_ = uVar4;
                            auVar120 = vpblendw_avx2(auVar143,ZEXT1632(auVar179),0xaa);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar69._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar69._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar69._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar69._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar69._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar69._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar69._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar69._28_4_ = auVar120._28_4_;
                            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar156,auVar69);
                            auVar120 = vpsrld_avx2(auVar143,0x10);
                            auVar120 = vcvtdq2ps_avx(auVar120);
                            auVar70._4_4_ = auVar120._4_4_ * 0.00012207031;
                            auVar70._0_4_ = auVar120._0_4_ * 0.00012207031;
                            auVar70._8_4_ = auVar120._8_4_ * 0.00012207031;
                            auVar70._12_4_ = auVar120._12_4_ * 0.00012207031;
                            auVar70._16_4_ = auVar120._16_4_ * 0.00012207031;
                            auVar70._20_4_ = auVar120._20_4_ * 0.00012207031;
                            auVar70._24_4_ = auVar120._24_4_ * 0.00012207031;
                            auVar70._28_4_ = auVar120._28_4_;
                            auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar156,auVar70);
                            local_2bc0 = local_2860._0_8_;
                            uStack_2bb8 = local_2860._8_8_;
                            uStack_2bb0 = local_2860._16_8_;
                            uStack_2ba8 = local_2860._24_8_;
                            local_2ba0 = local_2880._0_8_;
                            uStack_2b98 = local_2880._8_8_;
                            uStack_2b90 = local_2880._16_8_;
                            uStack_2b88 = local_2880._24_8_;
                            local_2b80 = local_28a0._0_8_;
                            uStack_2b78 = local_28a0._8_8_;
                            uStack_2b70 = local_28a0._16_8_;
                            uStack_2b68 = local_28a0._24_8_;
                            local_2b60 = ZEXT1632(auVar108);
                            local_2b00._4_4_ = uVar6;
                            local_2b00._0_4_ = uVar6;
                            local_2b00._8_4_ = uVar6;
                            local_2b00._12_4_ = uVar6;
                            local_2b00._16_4_ = uVar6;
                            local_2b00._20_4_ = uVar6;
                            local_2b00._24_4_ = uVar6;
                            local_2b00._28_4_ = uVar6;
                            local_2b40 = ZEXT1632(auVar135);
                            auVar135._4_4_ = uVar91;
                            auVar135._0_4_ = uVar91;
                            auVar135._8_4_ = uVar91;
                            auVar135._12_4_ = uVar91;
                            auVar144._16_4_ = uVar91;
                            auVar144._0_16_ = auVar135;
                            auVar144._20_4_ = uVar91;
                            auVar144._24_4_ = uVar91;
                            auVar144._28_4_ = uVar91;
                            vpcmpeqd_avx2(local_2b00,local_2b00);
                            local_2ae0 = context->user->instID[0];
                            local_2ac0 = context->user->instPrimID[0];
                            local_2e00 = *(undefined1 (*) [32])(ray + 0x100);
                            auVar120 = vblendvps_avx(local_2e00,local_2840,auVar93);
                            *(undefined1 (*) [32])(ray + 0x100) = auVar120;
                            local_2e30.valid = (int *)local_2d40;
                            local_2e30.geometryUserPtr = pGVar7->userPtr;
                            local_2e30.context = context->user;
                            local_2e30.hit = (RTCHitN *)&local_2bc0;
                            local_2e30.N = 8;
                            local_2e30.ray = (RTCRayN *)ray;
                            local_2d40 = auVar93;
                            local_2b20 = auVar144;
                            uStack_2adc = local_2ae0;
                            uStack_2ad8 = local_2ae0;
                            uStack_2ad4 = local_2ae0;
                            uStack_2ad0 = local_2ae0;
                            uStack_2acc = local_2ae0;
                            uStack_2ac8 = local_2ae0;
                            uStack_2ac4 = local_2ae0;
                            uStack_2abc = local_2ac0;
                            uStack_2ab8 = local_2ac0;
                            uStack_2ab4 = local_2ac0;
                            uStack_2ab0 = local_2ac0;
                            uStack_2aac = local_2ac0;
                            uStack_2aa8 = local_2ac0;
                            uStack_2aa4 = local_2ac0;
                            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              local_2d60._0_8_ = lVar87;
                              auVar173 = ZEXT1664(auVar160._0_16_);
                              auVar185 = ZEXT1664(auVar179);
                              auVar190 = ZEXT1664(auVar190._0_16_);
                              auVar198 = ZEXT1664(auVar193._0_16_);
                              auVar144 = ZEXT1632(auVar135);
                              (*pGVar7->occlusionFilterN)(&local_2e30);
                              auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                                            CONCAT424(0x7f800000,
                                                                      CONCAT420(0x7f800000,
                                                                                CONCAT416(0x7f800000
                                                                                          ,CONCAT412
                                                  (0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)))))));
                              lVar87 = local_2d60._0_8_;
                            }
                            auVar93 = vpcmpeqd_avx2(local_2d40,_DAT_01faff00);
                            auVar98 = vpcmpeqd_avx2(auVar144,auVar144);
                            auVar120 = auVar98 & ~auVar93;
                            if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar120 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0') &&
                                  (auVar120 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar120[0x1f]) {
                              auVar93 = auVar93 ^ auVar98;
                            }
                            else {
                              p_Var8 = context->args->filter;
                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar173 = ZEXT1664(auVar173._0_16_);
                                auVar185 = ZEXT1664(auVar185._0_16_);
                                auVar190 = ZEXT1664(auVar190._0_16_);
                                auVar198 = ZEXT1664(auVar198._0_16_);
                                (*p_Var8)(&local_2e30);
                                auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                                              CONCAT424(0x7f800000,
                                                                        CONCAT420(0x7f800000,
                                                                                  CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                              }
                              auVar120 = vpcmpeqd_avx2(local_2d40,_DAT_01faff00);
                              auVar93 = auVar120 ^ _DAT_01fe9960;
                              auVar145._8_4_ = 0xff800000;
                              auVar145._0_8_ = 0xff800000ff800000;
                              auVar145._12_4_ = 0xff800000;
                              auVar145._16_4_ = 0xff800000;
                              auVar145._20_4_ = 0xff800000;
                              auVar145._24_4_ = 0xff800000;
                              auVar145._28_4_ = 0xff800000;
                              auVar120 = vblendvps_avx(auVar145,*(undefined1 (*) [32])
                                                                 (local_2e30.ray + 0x100),auVar120);
                              *(undefined1 (*) [32])(local_2e30.ray + 0x100) = auVar120;
                            }
                            auVar120 = vblendvps_avx(local_2e00,*(undefined1 (*) [32])pRVar1,auVar93
                                                    );
                            *(undefined1 (*) [32])pRVar1 = auVar120;
                          }
                          auVar120 = vandnps_avx(auVar93,local_2de0);
                          auVar196 = ZEXT3264(auVar120);
                          auVar120 = local_2de0 & ~auVar93;
                          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar120 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0') &&
                                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                              (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar120[0x1f]) break;
                        }
                        lVar90 = lVar90 + 1;
                        auVar93 = auVar196._0_32_;
                      } while ((ulong)((ulong)uVar5 != 2) + 1 != lVar90);
                      unaff_R15 = 1;
                      bVar80 = (bool)(bVar79 & iVar81 != 2);
                      bVar79 = 0;
                    } while (bVar80);
                    auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
                    auVar102._0_4_ = auVar196._0_4_ ^ auVar93._0_4_;
                    auVar102._4_4_ = auVar196._4_4_ ^ auVar93._4_4_;
                    auVar102._8_4_ = auVar196._8_4_ ^ auVar93._8_4_;
                    auVar102._12_4_ = auVar196._12_4_ ^ auVar93._12_4_;
                    auVar102._16_4_ = auVar196._16_4_ ^ auVar93._16_4_;
                    auVar102._20_4_ = auVar196._20_4_ ^ auVar93._20_4_;
                    auVar102._24_4_ = auVar196._24_4_ ^ auVar93._24_4_;
                    auVar102._28_4_ = auVar196._28_4_ ^ auVar93._28_4_;
                    uVar85 = 0;
                    auVar196 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                  CONCAT424(0x3f7ffffa,
                                                            CONCAT420(0x3f7ffffa,
                                                                      CONCAT416(0x3f7ffffa,
                                                                                CONCAT412(0x3f7ffffa
                                                                                          ,CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                    auVar198 = ZEXT3264(CONCAT428(0x3f800003,
                                                  CONCAT424(0x3f800003,
                                                            CONCAT420(0x3f800003,
                                                                      CONCAT416(0x3f800003,
                                                                                CONCAT412(0x3f800003
                                                                                          ,CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  }
                  else {
                    local_2e40.super_Precalculations.grid =
                         (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                    uVar85 = *(ulong *)(local_2e40.super_Precalculations.grid +
                                       (ulong)*(uint *)(local_2e40.super_Precalculations.grid + 0x2c
                                                       ) + 0x30);
                    auVar93 = vpcmpeqd_avx2(auVar120,auVar120);
                    auVar102._8_8_ = uStack_28d8;
                    auVar102._0_8_ = local_28e0;
                    auVar102._16_8_ = uStack_28d0;
                    auVar102._24_8_ = uStack_28c8;
                  }
                  local_2cc0 = vorps_avx(auVar102,local_2cc0);
                  auVar93 = auVar93 & ~local_2cc0;
                  if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar93 >> 0x7f,0) == '\0') &&
                        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar93 >> 0xbf,0) == '\0') &&
                      (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar93[0x1f]) goto LAB_019d40f1;
                  auVar147._8_4_ = 0xff800000;
                  auVar147._0_8_ = 0xff800000ff800000;
                  auVar147._12_4_ = 0xff800000;
                  auVar147._16_4_ = 0xff800000;
                  auVar147._20_4_ = 0xff800000;
                  auVar147._24_4_ = 0xff800000;
                  auVar147._28_4_ = 0xff800000;
                  local_2900 = vblendvps_avx(local_2900,auVar147,local_2cc0);
                  if (uVar85 != 0) {
                    *puVar88 = uVar85;
                    puVar88 = puVar88 + 1;
                    *(undefined4 *)*pauVar84 = 0xff800000;
                    *(undefined4 *)(*pauVar84 + 4) = 0xff800000;
                    *(undefined4 *)(*pauVar84 + 8) = 0xff800000;
                    *(undefined4 *)(*pauVar84 + 0xc) = 0xff800000;
                    *(undefined4 *)(*pauVar84 + 0x10) = 0xff800000;
                    *(undefined4 *)(*pauVar84 + 0x14) = 0xff800000;
                    *(undefined4 *)(*pauVar84 + 0x18) = 0xff800000;
                    *(undefined4 *)(*pauVar84 + 0x1c) = 0xff800000;
                    pauVar84 = pauVar84 + 1;
                  }
                }
                goto LAB_019d2b20;
              }
              uVar85 = 8;
              lVar82 = 0;
              auVar93 = auVar194._0_32_;
              do {
                uVar83 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar82 * 8);
                if (uVar83 == 8) {
                  auVar122 = ZEXT3264(auVar93);
                  break;
                }
                uVar91 = *(undefined4 *)(root.ptr + 0x20 + lVar82 * 4);
                auVar109._4_4_ = uVar91;
                auVar109._0_4_ = uVar91;
                auVar109._8_4_ = uVar91;
                auVar109._12_4_ = uVar91;
                auVar109._16_4_ = uVar91;
                auVar109._20_4_ = uVar91;
                auVar109._24_4_ = uVar91;
                auVar109._28_4_ = uVar91;
                auVar149._8_8_ = local_2aa0._8_8_;
                auVar149._0_8_ = local_2aa0._0_8_;
                auVar149._16_8_ = local_2aa0._16_8_;
                auVar149._24_8_ = local_2aa0._24_8_;
                auVar162._8_8_ = local_2aa0._40_8_;
                auVar162._0_8_ = local_2aa0._32_8_;
                auVar162._16_8_ = local_2aa0._48_8_;
                auVar162._24_8_ = local_2aa0._56_8_;
                auVar71._8_8_ = local_2aa0._72_8_;
                auVar71._0_8_ = local_2aa0._64_8_;
                auVar71._16_8_ = local_2aa0._80_8_;
                auVar71._24_8_ = local_2aa0._88_8_;
                auVar120 = vsubps_avx(auVar109,auVar149);
                auVar122._0_4_ = (float)local_29e0._0_4_ * auVar120._0_4_;
                auVar122._4_4_ = (float)local_29e0._4_4_ * auVar120._4_4_;
                auVar122._8_4_ = fStack_29d8 * auVar120._8_4_;
                auVar122._12_4_ = fStack_29d4 * auVar120._12_4_;
                auVar122._16_4_ = fStack_29d0 * auVar120._16_4_;
                auVar122._20_4_ = fStack_29cc * auVar120._20_4_;
                auVar122._28_36_ = auVar173._28_36_;
                auVar122._24_4_ = fStack_29c8 * auVar120._24_4_;
                auVar156 = auVar122._0_32_;
                auVar173 = ZEXT3264(auVar156);
                uVar91 = *(undefined4 *)(root.ptr + 0x40 + lVar82 * 4);
                auVar110._4_4_ = uVar91;
                auVar110._0_4_ = uVar91;
                auVar110._8_4_ = uVar91;
                auVar110._12_4_ = uVar91;
                auVar110._16_4_ = uVar91;
                auVar110._20_4_ = uVar91;
                auVar110._24_4_ = uVar91;
                auVar110._28_4_ = uVar91;
                auVar120 = vsubps_avx(auVar110,auVar162);
                auVar186._0_4_ = (float)local_29c0._0_4_ * auVar120._0_4_;
                auVar186._4_4_ = (float)local_29c0._4_4_ * auVar120._4_4_;
                auVar186._8_4_ = fStack_29b8 * auVar120._8_4_;
                auVar186._12_4_ = fStack_29b4 * auVar120._12_4_;
                auVar186._16_4_ = fStack_29b0 * auVar120._16_4_;
                auVar186._20_4_ = fStack_29ac * auVar120._20_4_;
                auVar186._28_36_ = auVar185._28_36_;
                auVar186._24_4_ = fStack_29a8 * auVar120._24_4_;
                auVar99 = auVar186._0_32_;
                auVar185 = ZEXT3264(auVar99);
                uVar91 = *(undefined4 *)(root.ptr + 0x60 + lVar82 * 4);
                auVar111._4_4_ = uVar91;
                auVar111._0_4_ = uVar91;
                auVar111._8_4_ = uVar91;
                auVar111._12_4_ = uVar91;
                auVar111._16_4_ = uVar91;
                auVar111._20_4_ = uVar91;
                auVar111._24_4_ = uVar91;
                auVar111._28_4_ = uVar91;
                auVar120 = vsubps_avx(auVar111,auVar71);
                auVar191._0_4_ = (float)local_29a0._0_4_ * auVar120._0_4_;
                auVar191._4_4_ = (float)local_29a0._4_4_ * auVar120._4_4_;
                auVar191._8_4_ = fStack_2998 * auVar120._8_4_;
                auVar191._12_4_ = fStack_2994 * auVar120._12_4_;
                auVar191._16_4_ = fStack_2990 * auVar120._16_4_;
                auVar191._20_4_ = fStack_298c * auVar120._20_4_;
                auVar191._28_36_ = auVar190._28_36_;
                auVar191._24_4_ = fStack_2988 * auVar120._24_4_;
                auVar160 = auVar191._0_32_;
                auVar190 = ZEXT3264(auVar160);
                uVar91 = *(undefined4 *)(root.ptr + 0x30 + lVar82 * 4);
                auVar112._4_4_ = uVar91;
                auVar112._0_4_ = uVar91;
                auVar112._8_4_ = uVar91;
                auVar112._12_4_ = uVar91;
                auVar112._16_4_ = uVar91;
                auVar112._20_4_ = uVar91;
                auVar112._24_4_ = uVar91;
                auVar112._28_4_ = uVar91;
                auVar120 = vsubps_avx(auVar112,auVar149);
                auVar97._4_4_ = (float)local_29e0._4_4_ * auVar120._4_4_;
                auVar97._0_4_ = (float)local_29e0._0_4_ * auVar120._0_4_;
                auVar97._8_4_ = fStack_29d8 * auVar120._8_4_;
                auVar97._12_4_ = fStack_29d4 * auVar120._12_4_;
                auVar97._16_4_ = fStack_29d0 * auVar120._16_4_;
                auVar97._20_4_ = fStack_29cc * auVar120._20_4_;
                auVar97._24_4_ = fStack_29c8 * auVar120._24_4_;
                auVar97._28_4_ = (int)((ulong)local_2aa0._24_8_ >> 0x20);
                uVar91 = *(undefined4 *)(root.ptr + 0x50 + lVar82 * 4);
                auVar113._4_4_ = uVar91;
                auVar113._0_4_ = uVar91;
                auVar113._8_4_ = uVar91;
                auVar113._12_4_ = uVar91;
                auVar113._16_4_ = uVar91;
                auVar113._20_4_ = uVar91;
                auVar113._24_4_ = uVar91;
                auVar113._28_4_ = uVar91;
                auVar120 = vsubps_avx(auVar113,auVar162);
                auVar20._4_4_ = (float)local_29c0._4_4_ * auVar120._4_4_;
                auVar20._0_4_ = (float)local_29c0._0_4_ * auVar120._0_4_;
                auVar20._8_4_ = fStack_29b8 * auVar120._8_4_;
                auVar20._12_4_ = fStack_29b4 * auVar120._12_4_;
                auVar20._16_4_ = fStack_29b0 * auVar120._16_4_;
                auVar20._20_4_ = fStack_29ac * auVar120._20_4_;
                auVar20._24_4_ = fStack_29a8 * auVar120._24_4_;
                auVar20._28_4_ = (int)((ulong)local_2aa0._56_8_ >> 0x20);
                uVar91 = *(undefined4 *)(root.ptr + 0x70 + lVar82 * 4);
                auVar114._4_4_ = uVar91;
                auVar114._0_4_ = uVar91;
                auVar114._8_4_ = uVar91;
                auVar114._12_4_ = uVar91;
                auVar114._16_4_ = uVar91;
                auVar114._20_4_ = uVar91;
                auVar114._24_4_ = uVar91;
                auVar114._28_4_ = uVar91;
                auVar120 = vsubps_avx(auVar114,auVar71);
                auVar153._4_4_ = (float)local_29a0._4_4_ * auVar120._4_4_;
                auVar153._0_4_ = (float)local_29a0._0_4_ * auVar120._0_4_;
                auVar153._8_4_ = fStack_2998 * auVar120._8_4_;
                auVar153._12_4_ = fStack_2994 * auVar120._12_4_;
                auVar153._16_4_ = fStack_2990 * auVar120._16_4_;
                auVar153._20_4_ = fStack_298c * auVar120._20_4_;
                auVar153._24_4_ = fStack_2988 * auVar120._24_4_;
                auVar153._28_4_ = (int)((ulong)local_2aa0._88_8_ >> 0x20);
                auVar120 = vminps_avx(auVar156,auVar97);
                auVar98 = vminps_avx(auVar99,auVar20);
                auVar120 = vmaxps_avx(auVar120,auVar98);
                auVar98 = vminps_avx(auVar160,auVar153);
                auVar120 = vmaxps_avx(auVar120,auVar98);
                auVar164._4_4_ = auVar196._4_4_ * auVar120._4_4_;
                auVar164._0_4_ = auVar196._0_4_ * auVar120._0_4_;
                auVar164._8_4_ = auVar196._8_4_ * auVar120._8_4_;
                auVar164._12_4_ = auVar196._12_4_ * auVar120._12_4_;
                auVar164._16_4_ = auVar196._16_4_ * auVar120._16_4_;
                auVar164._20_4_ = auVar196._20_4_ * auVar120._20_4_;
                auVar164._24_4_ = auVar196._24_4_ * auVar120._24_4_;
                auVar164._28_4_ = auVar120._28_4_;
                auVar120 = vmaxps_avx(auVar156,auVar97);
                auVar98 = vmaxps_avx(auVar99,auVar20);
                auVar98 = vminps_avx(auVar120,auVar98);
                auVar120 = vmaxps_avx(auVar160,auVar153);
                auVar120 = vminps_avx(auVar98,auVar120);
                auVar23._4_4_ = auVar198._4_4_ * auVar120._4_4_;
                auVar23._0_4_ = auVar198._0_4_ * auVar120._0_4_;
                auVar23._8_4_ = auVar198._8_4_ * auVar120._8_4_;
                auVar23._12_4_ = auVar198._12_4_ * auVar120._12_4_;
                auVar23._16_4_ = auVar198._16_4_ * auVar120._16_4_;
                auVar23._20_4_ = auVar198._20_4_ * auVar120._20_4_;
                auVar23._24_4_ = auVar198._24_4_ * auVar120._24_4_;
                auVar23._28_4_ = auVar120._28_4_;
                auVar120 = vmaxps_avx(auVar164,local_2920);
                auVar98 = vminps_avx(auVar23,local_2900);
                auVar120 = vcmpps_avx(auVar120,auVar98,2);
                if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar120 >> 0x7f,0) == '\0') &&
                      (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar120 >> 0xbf,0) == '\0') &&
                    (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar120[0x1f]) {
                  auVar122 = ZEXT3264(auVar93);
                  uVar83 = uVar85;
                }
                else {
                  auVar120 = vblendvps_avx(auVar194._0_32_,auVar164,auVar120);
                  auVar122 = ZEXT3264(auVar120);
                  if (uVar85 != 8) {
                    *puVar88 = uVar85;
                    puVar88 = puVar88 + 1;
                    *pauVar84 = auVar93;
                    pauVar84 = pauVar84 + 1;
                  }
                }
                uVar85 = uVar83;
                lVar82 = lVar82 + 1;
                auVar93 = auVar122._0_32_;
              } while (lVar82 != 4);
              iVar81 = 4;
              if (uVar85 == 8) goto LAB_019d2ce5;
              auVar93 = vcmpps_avx(local_2900,auVar122._0_32_,6);
              uVar91 = vmovmskps_avx(auVar93);
              root.ptr = uVar85;
            } while ((byte)uVar86 < (byte)POPCOUNT(uVar91));
            *puVar88 = uVar85;
            puVar88 = puVar88 + 1;
            *pauVar84 = auVar122._0_32_;
            pauVar84 = pauVar84 + 1;
          }
          else {
            for (; unaff_R15 != 0; unaff_R15 = unaff_R15 - 1 & unaff_R15) {
              k = 0;
              for (uVar85 = unaff_R15; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              local_2de0._0_8_ = k;
              auVar173 = ZEXT1664(auVar173._0_16_);
              auVar185 = ZEXT1664(auVar185._0_16_);
              auVar190 = ZEXT1664(auVar190._0_16_);
              bVar80 = occluded1(local_2d10,local_2d18,root,k,&local_2e40,ray,
                                 (TravRayK<8,_true> *)&local_2aa0.field_0,context);
              if (bVar80) {
                *(undefined4 *)(local_2cc0 + local_2de0._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar93 = _DAT_01fe9960 & ~local_2cc0;
            if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar93 >> 0x7f,0) == '\0') &&
                  (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar93 >> 0xbf,0) == '\0') &&
                (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar93[0x1f]) {
              iVar81 = 3;
            }
            else {
              auVar93._8_4_ = 0xff800000;
              auVar93._0_8_ = 0xff800000ff800000;
              auVar93._12_4_ = 0xff800000;
              auVar93._16_4_ = 0xff800000;
              auVar93._20_4_ = 0xff800000;
              auVar93._24_4_ = 0xff800000;
              auVar93._28_4_ = 0xff800000;
              local_2900 = vblendvps_avx(local_2900,auVar93,local_2cc0);
              iVar81 = 2;
            }
            auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar196 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar198 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar122 = ZEXT3264(local_2e00);
            unaff_R15 = 0;
            if (uVar86 < (uint)POPCOUNT(uVar91)) goto LAB_019d2b5e;
          }
LAB_019d2ce5:
        } while ((iVar81 == 4) || (iVar81 == 2));
LAB_019d40f1:
        auVar93 = vandps_avx(local_28c0,local_2cc0);
        auVar121._8_4_ = 0xff800000;
        auVar121._0_8_ = 0xff800000ff800000;
        auVar121._12_4_ = 0xff800000;
        auVar121._16_4_ = 0xff800000;
        auVar121._20_4_ = 0xff800000;
        auVar121._24_4_ = 0xff800000;
        auVar121._28_4_ = 0xff800000;
        auVar93 = vmaskmovps_avx(auVar93,auVar121);
        *(undefined1 (*) [32])pRVar1 = auVar93;
        return;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }